

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive PVar13;
  int iVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  long lVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [28];
  undefined1 auVar79 [28];
  byte bVar80;
  uint uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  undefined1 auVar85 [8];
  ulong uVar86;
  Geometry *geometry;
  long lVar87;
  undefined4 uVar88;
  undefined8 uVar90;
  float fVar105;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar89;
  float fVar104;
  float fVar106;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar95 [16];
  undefined1 auVar103 [32];
  undefined8 uVar110;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  vint4 ai;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [64];
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  float fVar172;
  float fVar179;
  float fVar180;
  undefined1 auVar173 [16];
  float fVar181;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar195 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar178 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined4 uVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar193;
  float fVar200;
  undefined1 auVar194 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  undefined1 auVar209 [64];
  undefined1 auVar211 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_775;
  int local_774;
  RayQueryContext *local_770;
  Ray *local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [48];
  Precalculations *local_6f0;
  ulong local_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  ulong local_568;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  int iStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar86 = (ulong)(byte)PVar13;
  fVar123 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar23 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  auVar146._0_4_ = fVar123 * (ray->dir).field_0.m128[0];
  auVar146._4_4_ = fVar123 * (ray->dir).field_0.m128[1];
  auVar146._8_4_ = fVar123 * (ray->dir).field_0.m128[2];
  auVar146._12_4_ = fVar123 * (ray->dir).field_0.m128[3];
  auVar91._0_4_ = fVar123 * auVar23._0_4_;
  auVar91._4_4_ = fVar123 * auVar23._4_4_;
  auVar91._8_4_ = fVar123 * auVar23._8_4_;
  auVar91._12_4_ = fVar123 * auVar23._12_4_;
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xb + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar13 * 0xc + uVar86 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar82 = (ulong)(uint)((int)(uVar86 * 9) * 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar86 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar82 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar204._4_4_ = auVar146._0_4_;
  auVar204._0_4_ = auVar146._0_4_;
  auVar204._8_4_ = auVar146._0_4_;
  auVar204._12_4_ = auVar146._0_4_;
  auVar112 = vshufps_avx(auVar146,auVar146,0x55);
  auVar92 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar123 = auVar92._0_4_;
  auVar191._0_4_ = fVar123 * auVar19._0_4_;
  fVar89 = auVar92._4_4_;
  auVar191._4_4_ = fVar89 * auVar19._4_4_;
  fVar104 = auVar92._8_4_;
  auVar191._8_4_ = fVar104 * auVar19._8_4_;
  fVar105 = auVar92._12_4_;
  auVar191._12_4_ = fVar105 * auVar19._12_4_;
  auVar185._0_4_ = auVar22._0_4_ * fVar123;
  auVar185._4_4_ = auVar22._4_4_ * fVar89;
  auVar185._8_4_ = auVar22._8_4_ * fVar104;
  auVar185._12_4_ = auVar22._12_4_ * fVar105;
  auVar167._0_4_ = auVar124._0_4_ * fVar123;
  auVar167._4_4_ = auVar124._4_4_ * fVar89;
  auVar167._8_4_ = auVar124._8_4_ * fVar104;
  auVar167._12_4_ = auVar124._12_4_ * fVar105;
  auVar92 = vfmadd231ps_fma(auVar191,auVar112,auVar18);
  auVar113 = vfmadd231ps_fma(auVar185,auVar112,auVar21);
  auVar112 = vfmadd231ps_fma(auVar167,auVar93,auVar112);
  auVar134 = vfmadd231ps_fma(auVar92,auVar204,auVar23);
  auVar113 = vfmadd231ps_fma(auVar113,auVar204,auVar20);
  auVar142 = vfmadd231ps_fma(auVar112,auVar94,auVar204);
  auVar205._4_4_ = auVar91._0_4_;
  auVar205._0_4_ = auVar91._0_4_;
  auVar205._8_4_ = auVar91._0_4_;
  auVar205._12_4_ = auVar91._0_4_;
  auVar112 = vshufps_avx(auVar91,auVar91,0x55);
  auVar92 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar123 = auVar92._0_4_;
  auVar147._0_4_ = fVar123 * auVar19._0_4_;
  fVar89 = auVar92._4_4_;
  auVar147._4_4_ = fVar89 * auVar19._4_4_;
  fVar104 = auVar92._8_4_;
  auVar147._8_4_ = fVar104 * auVar19._8_4_;
  fVar105 = auVar92._12_4_;
  auVar147._12_4_ = fVar105 * auVar19._12_4_;
  auVar111._0_4_ = auVar22._0_4_ * fVar123;
  auVar111._4_4_ = auVar22._4_4_ * fVar89;
  auVar111._8_4_ = auVar22._8_4_ * fVar104;
  auVar111._12_4_ = auVar22._12_4_ * fVar105;
  auVar92._0_4_ = auVar124._0_4_ * fVar123;
  auVar92._4_4_ = auVar124._4_4_ * fVar89;
  auVar92._8_4_ = auVar124._8_4_ * fVar104;
  auVar92._12_4_ = auVar124._12_4_ * fVar105;
  auVar18 = vfmadd231ps_fma(auVar147,auVar112,auVar18);
  auVar19 = vfmadd231ps_fma(auVar111,auVar112,auVar21);
  auVar21 = vfmadd231ps_fma(auVar92,auVar112,auVar93);
  auVar22 = vfmadd231ps_fma(auVar18,auVar205,auVar23);
  auVar93 = vfmadd231ps_fma(auVar19,auVar205,auVar20);
  auVar124 = vfmadd231ps_fma(auVar21,auVar205,auVar94);
  local_2f0._8_4_ = 0x7fffffff;
  local_2f0._0_8_ = 0x7fffffff7fffffff;
  local_2f0._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx(auVar134,local_2f0);
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  auVar23 = vcmpps_avx(auVar23,auVar141,1);
  auVar18 = vblendvps_avx(auVar134,auVar141,auVar23);
  auVar23 = vandps_avx(auVar113,local_2f0);
  auVar23 = vcmpps_avx(auVar23,auVar141,1);
  auVar19 = vblendvps_avx(auVar113,auVar141,auVar23);
  auVar23 = vandps_avx(auVar142,local_2f0);
  auVar23 = vcmpps_avx(auVar23,auVar141,1);
  auVar23 = vblendvps_avx(auVar142,auVar141,auVar23);
  auVar20 = vrcpps_avx(auVar18);
  auVar163._8_4_ = 0x3f800000;
  auVar163._0_8_ = &DAT_3f8000003f800000;
  auVar163._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar18,auVar20,auVar163);
  auVar20 = vfmadd132ps_fma(auVar18,auVar20,auVar20);
  auVar18 = vrcpps_avx(auVar19);
  auVar19 = vfnmadd213ps_fma(auVar19,auVar18,auVar163);
  auVar21 = vfmadd132ps_fma(auVar19,auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar23);
  auVar19 = vfnmadd213ps_fma(auVar23,auVar18,auVar163);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar23 = vpmovsxwd_avx(auVar23);
  auVar94 = vfmadd132ps_fma(auVar19,auVar18,auVar18);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar22);
  auVar142._0_4_ = auVar20._0_4_ * auVar23._0_4_;
  auVar142._4_4_ = auVar20._4_4_ * auVar23._4_4_;
  auVar142._8_4_ = auVar20._8_4_ * auVar23._8_4_;
  auVar142._12_4_ = auVar20._12_4_ * auVar23._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar23 = vpmovsxwd_avx(auVar18);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar22);
  auVar148._0_4_ = auVar20._0_4_ * auVar23._0_4_;
  auVar148._4_4_ = auVar20._4_4_ * auVar23._4_4_;
  auVar148._8_4_ = auVar20._8_4_ * auVar23._8_4_;
  auVar148._12_4_ = auVar20._12_4_ * auVar23._12_4_;
  auVar113._1_3_ = 0;
  auVar113[0] = PVar13;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar18 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar86 * -2 + 6);
  auVar23 = vpmovsxwd_avx(auVar20);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar93);
  auVar168._0_4_ = auVar23._0_4_ * auVar21._0_4_;
  auVar168._4_4_ = auVar23._4_4_ * auVar21._4_4_;
  auVar168._8_4_ = auVar23._8_4_ * auVar21._8_4_;
  auVar168._12_4_ = auVar23._12_4_ * auVar21._12_4_;
  auVar23 = vcvtdq2ps_avx(auVar18);
  auVar23 = vsubps_avx(auVar23,auVar93);
  auVar112._0_4_ = auVar21._0_4_ * auVar23._0_4_;
  auVar112._4_4_ = auVar21._4_4_ * auVar23._4_4_;
  auVar112._8_4_ = auVar21._8_4_ * auVar23._8_4_;
  auVar112._12_4_ = auVar21._12_4_ * auVar23._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar82 + uVar86 + 6);
  auVar23 = vpmovsxwd_avx(auVar21);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar124);
  auVar134._0_4_ = auVar94._0_4_ * auVar23._0_4_;
  auVar134._4_4_ = auVar94._4_4_ * auVar23._4_4_;
  auVar134._8_4_ = auVar94._8_4_ * auVar23._8_4_;
  auVar134._12_4_ = auVar94._12_4_ * auVar23._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar86 * 0x17 + 6);
  auVar23 = vpmovsxwd_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar124);
  auVar93._0_4_ = auVar94._0_4_ * auVar23._0_4_;
  auVar93._4_4_ = auVar94._4_4_ * auVar23._4_4_;
  auVar93._8_4_ = auVar94._8_4_ * auVar23._8_4_;
  auVar93._12_4_ = auVar94._12_4_ * auVar23._12_4_;
  auVar23 = vpminsd_avx(auVar142,auVar148);
  auVar18 = vpminsd_avx(auVar168,auVar112);
  auVar23 = vmaxps_avx(auVar23,auVar18);
  auVar18 = vpminsd_avx(auVar134,auVar93);
  uVar88 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar173._4_4_ = uVar88;
  auVar173._0_4_ = uVar88;
  auVar173._8_4_ = uVar88;
  auVar173._12_4_ = uVar88;
  auVar18 = vmaxps_avx(auVar18,auVar173);
  auVar23 = vmaxps_avx(auVar23,auVar18);
  local_300._0_4_ = auVar23._0_4_ * 0.99999964;
  local_300._4_4_ = auVar23._4_4_ * 0.99999964;
  local_300._8_4_ = auVar23._8_4_ * 0.99999964;
  local_300._12_4_ = auVar23._12_4_ * 0.99999964;
  auVar166 = ZEXT1664(local_300);
  auVar23 = vpmaxsd_avx(auVar142,auVar148);
  auVar18 = vpmaxsd_avx(auVar168,auVar112);
  auVar23 = vminps_avx(auVar23,auVar18);
  auVar18 = vpmaxsd_avx(auVar134,auVar93);
  fVar123 = ray->tfar;
  auVar124._4_4_ = fVar123;
  auVar124._0_4_ = fVar123;
  auVar124._8_4_ = fVar123;
  auVar124._12_4_ = fVar123;
  auVar18 = vminps_avx(auVar18,auVar124);
  auVar23 = vminps_avx(auVar23,auVar18);
  auVar94._0_4_ = auVar23._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar23._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar23._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar23._12_4_ * 1.0000004;
  auVar113[4] = PVar13;
  auVar113._5_3_ = 0;
  auVar113[8] = PVar13;
  auVar113._9_3_ = 0;
  auVar113[0xc] = PVar13;
  auVar113._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar113,_DAT_01ff0cf0);
  auVar23 = vcmpps_avx(local_300,auVar94,2);
  auVar23 = vandps_avx(auVar23,auVar18);
  uVar81 = vmovmskps_avx(auVar23);
  local_775 = uVar81 != 0;
  if (local_775) {
    uVar81 = uVar81 & 0xff;
    local_420 = mm_lookupmask_ps._16_8_;
    uStack_418 = mm_lookupmask_ps._24_8_;
    uStack_410 = mm_lookupmask_ps._16_8_;
    uStack_408 = mm_lookupmask_ps._24_8_;
    do {
      auVar145 = local_380;
      local_2a0 = auVar166._0_32_;
      lVar25 = 0;
      uVar86 = (ulong)uVar81;
      for (uVar82 = uVar86; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_6e8 = (ulong)*(uint *)(prim + 2);
      pGVar15 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      _Var16 = pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_568 = (ulong)*(uint *)(prim + lVar25 * 4 + 6);
      uVar82 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                               _Var16 * *(uint *)(prim + lVar25 * 4 + 6));
      p_Var17 = pGVar15[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar15[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar25 + (long)p_Var17 * uVar82);
      local_660 = *(undefined8 *)*pauVar1;
      uStack_658 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar25 + (uVar82 + 1) * (long)p_Var17);
      local_490 = *(undefined8 *)*pauVar2;
      uStack_488 = *(undefined8 *)(*pauVar2 + 8);
      uVar84 = (uVar82 + 2) * (long)p_Var17;
      pauVar3 = (undefined1 (*) [16])(lVar25 + uVar84);
      local_4a0 = *(undefined8 *)*pauVar3;
      uStack_498 = *(undefined8 *)(*pauVar3 + 8);
      uVar86 = uVar86 - 1 & uVar86;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar82 + 3) * (long)p_Var17);
      local_4b0 = *(undefined8 *)*pauVar4;
      uStack_4a8 = *(undefined8 *)(*pauVar4 + 8);
      if (uVar86 != 0) {
        uVar83 = uVar86 - 1 & uVar86;
        lVar25 = 0;
        for (uVar82 = uVar86; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar84 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                 *(uint *)(prim + lVar25 * 4 + 6) * _Var16) * (long)p_Var17;
        if (uVar83 != 0) {
          for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar18 = vsubps_avx(*pauVar1,(undefined1  [16])aVar8);
      uVar88 = auVar18._0_4_;
      auVar143._4_4_ = uVar88;
      auVar143._0_4_ = uVar88;
      auVar143._8_4_ = uVar88;
      auVar143._12_4_ = uVar88;
      auVar23 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      aVar9 = (pre->ray_space).vx.field_0;
      aVar10 = (pre->ray_space).vy.field_0;
      fVar123 = (pre->ray_space).vz.field_0.m128[0];
      fVar89 = (pre->ray_space).vz.field_0.m128[1];
      fVar104 = (pre->ray_space).vz.field_0.m128[2];
      fVar105 = (pre->ray_space).vz.field_0.m128[3];
      auVar156._0_4_ = auVar18._0_4_ * fVar123;
      auVar156._4_4_ = auVar18._4_4_ * fVar89;
      auVar156._8_4_ = auVar18._8_4_ * fVar104;
      auVar156._12_4_ = auVar18._12_4_ * fVar105;
      auVar23 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar10,auVar23);
      auVar22 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar9,auVar143);
      auVar23 = vblendps_avx(auVar22,*pauVar1,8);
      auVar19 = vsubps_avx(*pauVar2,(undefined1  [16])aVar8);
      uVar88 = auVar19._0_4_;
      auVar157._4_4_ = uVar88;
      auVar157._0_4_ = uVar88;
      auVar157._8_4_ = uVar88;
      auVar157._12_4_ = uVar88;
      auVar18 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar186._0_4_ = auVar19._0_4_ * fVar123;
      auVar186._4_4_ = auVar19._4_4_ * fVar89;
      auVar186._8_4_ = auVar19._8_4_ * fVar104;
      auVar186._12_4_ = auVar19._12_4_ * fVar105;
      auVar18 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar10,auVar18);
      auVar94 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar9,auVar157);
      auVar18 = vblendps_avx(auVar94,*pauVar2,8);
      auVar20 = vsubps_avx(*pauVar3,(undefined1  [16])aVar8);
      uVar88 = auVar20._0_4_;
      auVar164._4_4_ = uVar88;
      auVar164._0_4_ = uVar88;
      auVar164._8_4_ = uVar88;
      auVar164._12_4_ = uVar88;
      auVar19 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar192._0_4_ = auVar20._0_4_ * fVar123;
      auVar192._4_4_ = auVar20._4_4_ * fVar89;
      auVar192._8_4_ = auVar20._8_4_ * fVar104;
      auVar192._12_4_ = auVar20._12_4_ * fVar105;
      auVar19 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar10,auVar19);
      auVar93 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar9,auVar164);
      auVar19 = vblendps_avx(auVar93,*pauVar3,8);
      auVar21 = vsubps_avx(*pauVar4,(undefined1  [16])aVar8);
      uVar88 = auVar21._0_4_;
      auVar165._4_4_ = uVar88;
      auVar165._0_4_ = uVar88;
      auVar165._8_4_ = uVar88;
      auVar165._12_4_ = uVar88;
      auVar20 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar194._0_4_ = auVar21._0_4_ * fVar123;
      auVar194._4_4_ = auVar21._4_4_ * fVar89;
      auVar194._8_4_ = auVar21._8_4_ * fVar104;
      auVar194._12_4_ = auVar21._12_4_ * fVar105;
      auVar20 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar10,auVar20);
      auVar124 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar9,auVar165);
      auVar20 = vblendps_avx(auVar124,*pauVar4,8);
      auVar23 = vandps_avx(auVar23,local_2f0);
      auVar18 = vandps_avx(auVar18,local_2f0);
      auVar21 = vmaxps_avx(auVar23,auVar18);
      auVar23 = vandps_avx(auVar19,local_2f0);
      auVar18 = vandps_avx(auVar20,local_2f0);
      auVar23 = vmaxps_avx(auVar23,auVar18);
      auVar23 = vmaxps_avx(auVar21,auVar23);
      auVar18 = vmovshdup_avx(auVar23);
      auVar18 = vmaxss_avx(auVar18,auVar23);
      auVar23 = vshufpd_avx(auVar23,auVar23,1);
      auVar23 = vmaxss_avx(auVar23,auVar18);
      lVar25 = (long)iVar14 * 0x44;
      auVar18 = vmovshdup_avx(auVar22);
      uVar90 = auVar18._0_8_;
      local_3a0._8_8_ = uVar90;
      local_3a0._0_8_ = uVar90;
      local_3a0._16_8_ = uVar90;
      local_3a0._24_8_ = uVar90;
      auVar11 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar18 = vmovshdup_avx(auVar94);
      uVar90 = auVar18._0_8_;
      local_600._8_8_ = uVar90;
      local_600._0_8_ = uVar90;
      local_600._16_8_ = uVar90;
      local_600._24_8_ = uVar90;
      auVar161 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      uVar190 = auVar93._0_4_;
      local_680._4_4_ = uVar190;
      local_680._0_4_ = uVar190;
      local_680._8_4_ = uVar190;
      local_680._12_4_ = uVar190;
      local_680._16_4_ = uVar190;
      local_680._20_4_ = uVar190;
      local_680._24_4_ = uVar190;
      local_680._28_4_ = uVar190;
      auVar18 = vmovshdup_avx(auVar93);
      uVar90 = auVar18._0_8_;
      local_5e0._8_8_ = uVar90;
      local_5e0._0_8_ = uVar90;
      local_5e0._16_8_ = uVar90;
      local_5e0._24_8_ = uVar90;
      fVar89 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      fVar104 = *(float *)(bezier_basis0 + lVar25 + 0xd90);
      fVar105 = *(float *)(bezier_basis0 + lVar25 + 0xd94);
      fVar106 = *(float *)(bezier_basis0 + lVar25 + 0xd98);
      fVar107 = *(float *)(bezier_basis0 + lVar25 + 0xd9c);
      fVar108 = *(float *)(bezier_basis0 + lVar25 + 0xda0);
      fVar109 = *(float *)(bezier_basis0 + lVar25 + 0xda4);
      auVar78 = *(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      local_540 = auVar124._0_4_;
      auVar18 = vmovshdup_avx(auVar124);
      uVar90 = auVar18._0_8_;
      auVar119._0_4_ = fVar89 * local_540;
      auVar119._4_4_ = fVar104 * local_540;
      auVar119._8_4_ = fVar105 * local_540;
      auVar119._12_4_ = fVar106 * local_540;
      auVar119._16_4_ = fVar107 * local_540;
      auVar119._20_4_ = fVar108 * local_540;
      auVar119._24_4_ = fVar109 * local_540;
      auVar119._28_4_ = 0;
      local_4e0 = auVar18._0_4_;
      auVar96._0_4_ = local_4e0 * fVar89;
      fStack_4dc = auVar18._4_4_;
      auVar96._4_4_ = fStack_4dc * fVar104;
      auVar96._8_4_ = local_4e0 * fVar105;
      auVar96._12_4_ = fStack_4dc * fVar106;
      auVar96._16_4_ = local_4e0 * fVar107;
      auVar96._20_4_ = fStack_4dc * fVar108;
      auVar96._24_4_ = local_4e0 * fVar109;
      auVar96._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar119,auVar161,local_680);
      auVar19 = vfmadd231ps_fma(auVar96,auVar161,local_5e0);
      uVar88 = auVar94._0_4_;
      local_6e0._4_4_ = uVar88;
      local_6e0._0_4_ = uVar88;
      local_6e0._8_4_ = uVar88;
      local_6e0._12_4_ = uVar88;
      local_6e0._16_4_ = uVar88;
      local_6e0._20_4_ = uVar88;
      local_6e0._24_4_ = uVar88;
      local_6e0._28_4_ = uVar88;
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar11,local_6e0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,local_600);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar88 = auVar22._0_4_;
      local_6a0._4_4_ = uVar88;
      local_6a0._0_4_ = uVar88;
      local_6a0._8_4_ = uVar88;
      local_6a0._12_4_ = uVar88;
      local_6a0._16_4_ = uVar88;
      local_6a0._20_4_ = uVar88;
      local_6a0._24_4_ = uVar88;
      local_6a0._28_4_ = uVar88;
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar96,local_6a0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar96,local_3a0);
      auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      fVar193 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar25 + 0xd8c);
      fVar200 = *(float *)(bezier_basis1 + lVar25 + 0xd90);
      fVar70 = *(float *)(bezier_basis1 + lVar25 + 0xd94);
      fVar71 = *(float *)(bezier_basis1 + lVar25 + 0xd98);
      fVar72 = *(float *)(bezier_basis1 + lVar25 + 0xd9c);
      fVar73 = *(float *)(bezier_basis1 + lVar25 + 0xda0);
      fVar172 = *(float *)(bezier_basis1 + lVar25 + 0xda4);
      auVar79 = *(undefined1 (*) [28])(bezier_basis1 + lVar25 + 0xd8c);
      fStack_53c = local_540;
      fStack_538 = local_540;
      fStack_534 = local_540;
      fStack_530 = local_540;
      fStack_52c = local_540;
      fStack_528 = local_540;
      fStack_524 = local_540;
      auVar177._4_4_ = fVar200 * local_540;
      auVar177._0_4_ = fVar193 * local_540;
      auVar177._8_4_ = fVar70 * local_540;
      auVar177._12_4_ = fVar71 * local_540;
      auVar177._16_4_ = fVar72 * local_540;
      auVar177._20_4_ = fVar73 * local_540;
      auVar177._24_4_ = fVar172 * local_540;
      auVar177._28_4_ = local_540;
      auVar20 = vfmadd231ps_fma(auVar177,auVar119,local_680);
      auVar12._4_4_ = fStack_4dc * fVar200;
      auVar12._0_4_ = local_4e0 * fVar193;
      auVar12._8_4_ = local_4e0 * fVar70;
      auVar12._12_4_ = fStack_4dc * fVar71;
      auVar12._16_4_ = local_4e0 * fVar72;
      auVar12._20_4_ = fStack_4dc * fVar73;
      auVar12._24_4_ = local_4e0 * fVar172;
      auVar12._28_4_ = uVar190;
      auVar21 = vfmadd231ps_fma(auVar12,auVar119,local_5e0);
      auVar177 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar155 = ZEXT3264(auVar177);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar177,local_6e0);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar177,local_600);
      auVar12 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar12,local_6a0);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar12,local_3a0);
      auVar114 = ZEXT1632(auVar20);
      auVar158 = ZEXT1632(auVar18);
      auVar24 = vsubps_avx(auVar114,auVar158);
      auVar129 = ZEXT1632(auVar21);
      auVar97 = ZEXT1632(auVar19);
      auVar132 = vsubps_avx(auVar129,auVar97);
      auVar98._0_4_ = auVar19._0_4_ * auVar24._0_4_;
      auVar98._4_4_ = auVar19._4_4_ * auVar24._4_4_;
      auVar98._8_4_ = auVar19._8_4_ * auVar24._8_4_;
      auVar98._12_4_ = auVar19._12_4_ * auVar24._12_4_;
      auVar98._16_4_ = auVar24._16_4_ * 0.0;
      auVar98._20_4_ = auVar24._20_4_ * 0.0;
      auVar98._24_4_ = auVar24._24_4_ * 0.0;
      auVar98._28_4_ = 0;
      fVar179 = auVar132._0_4_;
      auVar115._0_4_ = fVar179 * auVar18._0_4_;
      fVar180 = auVar132._4_4_;
      auVar115._4_4_ = fVar180 * auVar18._4_4_;
      fVar181 = auVar132._8_4_;
      auVar115._8_4_ = fVar181 * auVar18._8_4_;
      fVar182 = auVar132._12_4_;
      auVar115._12_4_ = fVar182 * auVar18._12_4_;
      fVar183 = auVar132._16_4_;
      auVar115._16_4_ = fVar183 * 0.0;
      fVar184 = auVar132._20_4_;
      auVar115._20_4_ = fVar184 * 0.0;
      fVar210 = auVar132._24_4_;
      auVar115._24_4_ = fVar210 * 0.0;
      auVar115._28_4_ = 0;
      auVar98 = vsubps_avx(auVar98,auVar115);
      auVar18 = vpermilps_avx(*pauVar1,0xff);
      uVar110 = auVar18._0_8_;
      local_80._8_8_ = uVar110;
      local_80._0_8_ = uVar110;
      local_80._16_8_ = uVar110;
      local_80._24_8_ = uVar110;
      auVar19 = vpermilps_avx(*pauVar2,0xff);
      uVar110 = auVar19._0_8_;
      local_a0._8_8_ = uVar110;
      local_a0._0_8_ = uVar110;
      local_a0._16_8_ = uVar110;
      local_a0._24_8_ = uVar110;
      auVar19 = vpermilps_avx(*pauVar3,0xff);
      uVar110 = auVar19._0_8_;
      local_c0._8_8_ = uVar110;
      local_c0._0_8_ = uVar110;
      local_c0._16_8_ = uVar110;
      local_c0._24_8_ = uVar110;
      auVar19 = vpermilps_avx(*pauVar4,0xff);
      local_e0 = auVar19._0_8_;
      fVar123 = auVar19._0_4_;
      auVar159._0_4_ = fVar89 * fVar123;
      fVar89 = auVar19._4_4_;
      auVar159._4_4_ = fVar104 * fVar89;
      auVar159._8_4_ = fVar105 * fVar123;
      auVar159._12_4_ = fVar106 * fVar89;
      auVar159._16_4_ = fVar107 * fVar123;
      auVar159._20_4_ = fVar108 * fVar89;
      auVar159._24_4_ = fVar109 * fVar123;
      auVar159._28_4_ = 0;
      auVar19 = vfmadd231ps_fma(auVar159,local_c0,auVar161);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,auVar11);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar96,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar103._4_4_ = fVar200 * fVar89;
      auVar103._0_4_ = fVar193 * fVar123;
      auVar103._8_4_ = fVar70 * fVar123;
      auVar103._12_4_ = fVar71 * fVar89;
      auVar103._16_4_ = fVar72 * fVar123;
      auVar103._20_4_ = fVar73 * fVar89;
      auVar103._24_4_ = fVar172 * fVar123;
      auVar103._28_4_ = auVar96._28_4_;
      auVar20 = vfmadd231ps_fma(auVar103,auVar119,local_c0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar177,local_a0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar12,local_80);
      auVar195._4_4_ = fVar180 * fVar180;
      auVar195._0_4_ = fVar179 * fVar179;
      auVar195._8_4_ = fVar181 * fVar181;
      auVar195._12_4_ = fVar182 * fVar182;
      auVar195._16_4_ = fVar183 * fVar183;
      auVar195._20_4_ = fVar184 * fVar184;
      auVar195._24_4_ = fVar210 * fVar210;
      auVar195._28_4_ = auVar18._4_4_;
      auVar18 = vfmadd231ps_fma(auVar195,auVar24,auVar24);
      auVar103 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
      auVar201._4_4_ = auVar103._4_4_ * auVar103._4_4_ * auVar18._4_4_;
      auVar201._0_4_ = auVar103._0_4_ * auVar103._0_4_ * auVar18._0_4_;
      auVar201._8_4_ = auVar103._8_4_ * auVar103._8_4_ * auVar18._8_4_;
      auVar201._12_4_ = auVar103._12_4_ * auVar103._12_4_ * auVar18._12_4_;
      auVar201._16_4_ = auVar103._16_4_ * auVar103._16_4_ * 0.0;
      auVar201._20_4_ = auVar103._20_4_ * auVar103._20_4_ * 0.0;
      auVar201._24_4_ = auVar103._24_4_ * auVar103._24_4_ * 0.0;
      auVar201._28_4_ = auVar103._28_4_;
      auVar202._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar202._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar202._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar202._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar202._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar202._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar202._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar202._28_4_ = auVar98._28_4_;
      auVar103 = vcmpps_avx(auVar202,auVar201,2);
      fVar123 = auVar23._0_4_ * 4.7683716e-07;
      local_720._0_16_ = ZEXT416((uint)fVar123);
      auVar99._0_4_ = (float)iVar14;
      local_380._4_12_ = auVar93._4_12_;
      local_380._0_4_ = auVar99._0_4_;
      local_380._16_16_ = auVar145._16_16_;
      auVar99._4_4_ = auVar99._0_4_;
      auVar99._8_4_ = auVar99._0_4_;
      auVar99._12_4_ = auVar99._0_4_;
      auVar99._16_4_ = auVar99._0_4_;
      auVar99._20_4_ = auVar99._0_4_;
      auVar99._24_4_ = auVar99._0_4_;
      auVar99._28_4_ = auVar99._0_4_;
      auVar145 = vcmpps_avx(_DAT_02020f40,auVar99,1);
      auVar18 = vpermilps_avx(auVar22,0xaa);
      uVar110 = auVar18._0_8_;
      local_3e0._8_8_ = uVar110;
      local_3e0._0_8_ = uVar110;
      local_3e0._16_8_ = uVar110;
      local_3e0._24_8_ = uVar110;
      auVar23 = vpermilps_avx(auVar94,0xaa);
      uVar110 = auVar23._0_8_;
      local_5c0._8_8_ = uVar110;
      local_5c0._0_8_ = uVar110;
      local_5c0._16_8_ = uVar110;
      local_5c0._24_8_ = uVar110;
      auVar203 = ZEXT3264(local_5c0);
      auVar23 = vshufps_avx(auVar93,auVar93,0xaa);
      uVar110 = auVar23._0_8_;
      local_140._8_8_ = uVar110;
      local_140._0_8_ = uVar110;
      local_140._16_8_ = uVar110;
      local_140._24_8_ = uVar110;
      auVar23 = vshufps_avx(auVar124,auVar124,0xaa);
      uVar110 = auVar23._0_8_;
      register0x00001508 = uVar110;
      local_480 = uVar110;
      register0x00001510 = uVar110;
      register0x00001518 = uVar110;
      auVar198 = ZEXT3264(_local_480);
      auVar98 = auVar145 & auVar103;
      uVar81 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      local_460._0_16_ = ZEXT416(uVar81);
      fStack_4d8 = local_4e0;
      fStack_4d4 = fStack_4dc;
      fStack_4d0 = local_4e0;
      fStack_4cc = fStack_4dc;
      fStack_4c8 = local_4e0;
      fStack_4c4 = fStack_4dc;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      {
        uVar84 = 0;
        auVar166 = ZEXT3264(local_2a0);
        auVar122 = ZEXT3264(local_600);
        auVar140 = ZEXT3264(local_680);
        auVar171 = ZEXT3264(local_5e0);
        auVar178 = ZEXT3264(CONCAT428(fStack_4dc,
                                      CONCAT424(local_4e0,
                                                CONCAT420(fStack_4dc,
                                                          CONCAT416(local_4e0,
                                                                    CONCAT412(fStack_4dc,
                                                                              CONCAT48(local_4e0,
                                                                                       uVar90)))))))
        ;
        auVar209 = ZEXT3264(local_6e0);
        auVar211 = ZEXT3264(local_6a0);
      }
      else {
        _local_320 = vandps_avx(auVar103,auVar145);
        local_400._0_4_ = auVar79._0_4_;
        local_400._4_4_ = auVar79._4_4_;
        fStack_3f8 = auVar79._8_4_;
        fStack_3f4 = auVar79._12_4_;
        fStack_3f0 = auVar79._16_4_;
        fStack_3ec = auVar79._20_4_;
        fStack_3e8 = auVar79._24_4_;
        fVar193 = auVar23._0_4_;
        fVar200 = auVar23._4_4_;
        auVar145._4_4_ = fVar200 * (float)local_400._4_4_;
        auVar145._0_4_ = fVar193 * (float)local_400._0_4_;
        auVar145._8_4_ = fVar193 * fStack_3f8;
        auVar145._12_4_ = fVar200 * fStack_3f4;
        auVar145._16_4_ = fVar193 * fStack_3f0;
        auVar145._20_4_ = fVar200 * fStack_3ec;
        auVar145._24_4_ = fVar193 * fStack_3e8;
        auVar145._28_4_ = local_320._28_4_;
        auVar23 = vfmadd213ps_fma(auVar119,local_140,auVar145);
        auVar23 = vfmadd213ps_fma(auVar177,local_5c0,ZEXT1632(auVar23));
        auVar23 = vfmadd213ps_fma(auVar12,local_3e0,ZEXT1632(auVar23));
        _local_400 = ZEXT1632(auVar23);
        local_3c0._0_4_ = auVar78._0_4_;
        local_3c0._4_4_ = auVar78._4_4_;
        fStack_3b8 = auVar78._8_4_;
        fStack_3b4 = auVar78._12_4_;
        fStack_3b0 = auVar78._16_4_;
        fStack_3ac = auVar78._20_4_;
        fStack_3a8 = auVar78._24_4_;
        auVar27._4_4_ = fVar200 * (float)local_3c0._4_4_;
        auVar27._0_4_ = fVar193 * (float)local_3c0._0_4_;
        auVar27._8_4_ = fVar193 * fStack_3b8;
        auVar27._12_4_ = fVar200 * fStack_3b4;
        auVar27._16_4_ = fVar193 * fStack_3b0;
        auVar27._20_4_ = fVar200 * fStack_3ac;
        auVar27._24_4_ = fVar193 * fStack_3a8;
        auVar27._28_4_ = local_320._28_4_;
        auVar23 = vfmadd213ps_fma(auVar161,local_140,auVar27);
        auVar23 = vfmadd213ps_fma(auVar11,local_5c0,ZEXT1632(auVar23));
        auVar145 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar11 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar161 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        fVar89 = *(float *)(bezier_basis0 + lVar25 + 0x1f9c);
        fVar104 = *(float *)(bezier_basis0 + lVar25 + 0x1fa0);
        fVar105 = *(float *)(bezier_basis0 + lVar25 + 0x1fa4);
        fVar106 = *(float *)(bezier_basis0 + lVar25 + 0x1fa8);
        fVar107 = *(float *)(bezier_basis0 + lVar25 + 0x1fac);
        fVar108 = *(float *)(bezier_basis0 + lVar25 + 0x1fb0);
        fVar109 = *(float *)(bezier_basis0 + lVar25 + 0x1fb4);
        auVar151._0_4_ = local_540 * fVar89;
        auVar151._4_4_ = local_540 * fVar104;
        auVar151._8_4_ = local_540 * fVar105;
        auVar151._12_4_ = local_540 * fVar106;
        auVar151._16_4_ = local_540 * fVar107;
        auVar151._20_4_ = local_540 * fVar108;
        auVar151._24_4_ = local_540 * fVar109;
        auVar151._28_4_ = 0;
        auVar169._0_4_ = local_4e0 * fVar89;
        auVar169._4_4_ = fStack_4dc * fVar104;
        auVar169._8_4_ = local_4e0 * fVar105;
        auVar169._12_4_ = fStack_4dc * fVar106;
        auVar169._16_4_ = local_4e0 * fVar107;
        auVar169._20_4_ = fStack_4dc * fVar108;
        auVar169._24_4_ = local_4e0 * fVar109;
        auVar169._28_4_ = 0;
        auVar187._0_4_ = fVar193 * fVar89;
        auVar187._4_4_ = fVar200 * fVar104;
        auVar187._8_4_ = fVar193 * fVar105;
        auVar187._12_4_ = fVar200 * fVar106;
        auVar187._16_4_ = fVar193 * fVar107;
        auVar187._20_4_ = fVar200 * fVar108;
        auVar187._24_4_ = fVar193 * fVar109;
        auVar187._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar151,auVar161,local_680);
        auVar22 = vfmadd231ps_fma(auVar169,auVar161,local_5e0);
        auVar94 = vfmadd231ps_fma(auVar187,local_140,auVar161);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,local_6e0);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,local_600);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar11,local_5c0);
        _local_3c0 = auVar132;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar145,local_6a0);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar145,local_3a0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_3e0,auVar145);
        fVar89 = *(float *)(bezier_basis1 + lVar25 + 0x1f9c);
        fVar104 = *(float *)(bezier_basis1 + lVar25 + 0x1fa0);
        fVar105 = *(float *)(bezier_basis1 + lVar25 + 0x1fa4);
        fVar106 = *(float *)(bezier_basis1 + lVar25 + 0x1fa8);
        fVar107 = *(float *)(bezier_basis1 + lVar25 + 0x1fac);
        fVar108 = *(float *)(bezier_basis1 + lVar25 + 0x1fb0);
        fVar109 = *(float *)(bezier_basis1 + lVar25 + 0x1fb4);
        auVar11._4_4_ = local_540 * fVar104;
        auVar11._0_4_ = local_540 * fVar89;
        auVar11._8_4_ = local_540 * fVar105;
        auVar11._12_4_ = local_540 * fVar106;
        auVar11._16_4_ = local_540 * fVar107;
        auVar11._20_4_ = local_540 * fVar108;
        auVar11._24_4_ = local_540 * fVar109;
        auVar11._28_4_ = auVar145._28_4_;
        auVar161._4_4_ = fStack_4dc * fVar104;
        auVar161._0_4_ = local_4e0 * fVar89;
        auVar161._8_4_ = local_4e0 * fVar105;
        auVar161._12_4_ = fStack_4dc * fVar106;
        auVar161._16_4_ = local_4e0 * fVar107;
        auVar161._20_4_ = fStack_4dc * fVar108;
        auVar161._24_4_ = local_4e0 * fVar109;
        auVar161._28_4_ = fVar200;
        auVar28._4_4_ = fVar200 * fVar104;
        auVar28._0_4_ = fVar193 * fVar89;
        auVar28._8_4_ = fVar193 * fVar105;
        auVar28._12_4_ = fVar200 * fVar106;
        auVar28._16_4_ = fVar193 * fVar107;
        auVar28._20_4_ = fVar200 * fVar108;
        auVar28._24_4_ = fVar193 * fVar109;
        auVar28._28_4_ = auVar18._4_4_;
        auVar145 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar18 = vfmadd231ps_fma(auVar11,auVar145,local_680);
        auVar93 = vfmadd231ps_fma(auVar161,auVar145,local_5e0);
        auVar124 = vfmadd231ps_fma(auVar28,auVar145,local_140);
        auVar145 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar145,local_6e0);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar145,local_600);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),local_5c0,auVar145);
        auVar145 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar145,local_6a0);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar145,local_3a0);
        auVar116._8_4_ = 0x7fffffff;
        auVar116._0_8_ = 0x7fffffff7fffffff;
        auVar116._12_4_ = 0x7fffffff;
        auVar116._16_4_ = 0x7fffffff;
        auVar116._20_4_ = 0x7fffffff;
        auVar116._24_4_ = 0x7fffffff;
        auVar116._28_4_ = 0x7fffffff;
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),local_3e0,auVar145);
        auVar145 = vandps_avx(ZEXT1632(auVar21),auVar116);
        auVar11 = vandps_avx(ZEXT1632(auVar22),auVar116);
        auVar11 = vmaxps_avx(auVar145,auVar11);
        auVar145 = vandps_avx(ZEXT1632(auVar94),auVar116);
        auVar145 = vmaxps_avx(auVar11,auVar145);
        auVar130._4_4_ = fVar123;
        auVar130._0_4_ = fVar123;
        auVar130._8_4_ = fVar123;
        auVar130._12_4_ = fVar123;
        auVar130._16_4_ = fVar123;
        auVar130._20_4_ = fVar123;
        auVar130._24_4_ = fVar123;
        auVar130._28_4_ = fVar123;
        auVar145 = vcmpps_avx(auVar145,auVar130,1);
        auVar161 = vblendvps_avx(ZEXT1632(auVar21),auVar24,auVar145);
        auVar119 = vblendvps_avx(ZEXT1632(auVar22),auVar132,auVar145);
        auVar145 = vandps_avx(ZEXT1632(auVar18),auVar116);
        auVar11 = vandps_avx(ZEXT1632(auVar93),auVar116);
        auVar177 = vmaxps_avx(auVar145,auVar11);
        auVar145 = vandps_avx(ZEXT1632(auVar124),auVar116);
        auVar145 = vmaxps_avx(auVar177,auVar145);
        auVar12 = vcmpps_avx(auVar145,auVar130,1);
        auVar145 = vblendvps_avx(ZEXT1632(auVar18),auVar24,auVar12);
        auVar177 = vblendvps_avx(ZEXT1632(auVar93),auVar132,auVar12);
        auVar23 = vfmadd213ps_fma(auVar96,local_3e0,ZEXT1632(auVar23));
        auVar18 = vfmadd213ps_fma(auVar161,auVar161,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar119,auVar119);
        auVar96 = vrsqrtps_avx(ZEXT1632(auVar18));
        fVar89 = auVar96._0_4_;
        fVar104 = auVar96._4_4_;
        fVar105 = auVar96._8_4_;
        fVar106 = auVar96._12_4_;
        fVar107 = auVar96._16_4_;
        fVar108 = auVar96._20_4_;
        fVar109 = auVar96._24_4_;
        auVar24._4_4_ = fVar104 * fVar104 * fVar104 * auVar18._4_4_ * -0.5;
        auVar24._0_4_ = fVar89 * fVar89 * fVar89 * auVar18._0_4_ * -0.5;
        auVar24._8_4_ = fVar105 * fVar105 * fVar105 * auVar18._8_4_ * -0.5;
        auVar24._12_4_ = fVar106 * fVar106 * fVar106 * auVar18._12_4_ * -0.5;
        auVar24._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar24._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar24._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar24._28_4_ = auVar11._28_4_;
        auVar206._8_4_ = 0x3fc00000;
        auVar206._0_8_ = 0x3fc000003fc00000;
        auVar206._12_4_ = 0x3fc00000;
        auVar206._16_4_ = 0x3fc00000;
        auVar206._20_4_ = 0x3fc00000;
        auVar206._24_4_ = 0x3fc00000;
        auVar206._28_4_ = 0x3fc00000;
        auVar18 = vfmadd231ps_fma(auVar24,auVar206,auVar96);
        fVar89 = auVar18._0_4_;
        fVar104 = auVar18._4_4_;
        auVar132._4_4_ = fVar104 * auVar119._4_4_;
        auVar132._0_4_ = fVar89 * auVar119._0_4_;
        fVar105 = auVar18._8_4_;
        auVar132._8_4_ = fVar105 * auVar119._8_4_;
        fVar106 = auVar18._12_4_;
        auVar132._12_4_ = fVar106 * auVar119._12_4_;
        auVar132._16_4_ = auVar119._16_4_ * 0.0;
        auVar132._20_4_ = auVar119._20_4_ * 0.0;
        auVar132._24_4_ = auVar119._24_4_ * 0.0;
        auVar132._28_4_ = 0;
        auVar29._4_4_ = fVar104 * -auVar161._4_4_;
        auVar29._0_4_ = fVar89 * -auVar161._0_4_;
        auVar29._8_4_ = fVar105 * -auVar161._8_4_;
        auVar29._12_4_ = fVar106 * -auVar161._12_4_;
        auVar29._16_4_ = -auVar161._16_4_ * 0.0;
        auVar29._20_4_ = -auVar161._20_4_ * 0.0;
        auVar29._24_4_ = -auVar161._24_4_ * 0.0;
        auVar29._28_4_ = auVar96._28_4_;
        auVar18 = vfmadd213ps_fma(auVar145,auVar145,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar177,auVar177);
        auVar11 = vrsqrtps_avx(ZEXT1632(auVar18));
        auVar30._28_4_ = auVar12._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * 0.0,
                                CONCAT48(fVar105 * 0.0,CONCAT44(fVar104 * 0.0,fVar89 * 0.0))));
        fVar89 = auVar11._0_4_;
        fVar104 = auVar11._4_4_;
        fVar105 = auVar11._8_4_;
        fVar106 = auVar11._12_4_;
        fVar107 = auVar11._16_4_;
        fVar108 = auVar11._20_4_;
        fVar109 = auVar11._24_4_;
        auVar31._4_4_ = fVar104 * fVar104 * fVar104 * auVar18._4_4_ * -0.5;
        auVar31._0_4_ = fVar89 * fVar89 * fVar89 * auVar18._0_4_ * -0.5;
        auVar31._8_4_ = fVar105 * fVar105 * fVar105 * auVar18._8_4_ * -0.5;
        auVar31._12_4_ = fVar106 * fVar106 * fVar106 * auVar18._12_4_ * -0.5;
        auVar31._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar31._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar31._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar31._28_4_ = 0;
        auVar18 = vfmadd231ps_fma(auVar31,auVar206,auVar11);
        fVar89 = auVar18._0_4_;
        auVar188._0_4_ = auVar177._0_4_ * fVar89;
        fVar104 = auVar18._4_4_;
        auVar188._4_4_ = auVar177._4_4_ * fVar104;
        fVar105 = auVar18._8_4_;
        auVar188._8_4_ = auVar177._8_4_ * fVar105;
        fVar106 = auVar18._12_4_;
        auVar188._12_4_ = auVar177._12_4_ * fVar106;
        auVar188._16_4_ = auVar177._16_4_ * 0.0;
        auVar188._20_4_ = auVar177._20_4_ * 0.0;
        auVar188._24_4_ = auVar177._24_4_ * 0.0;
        auVar188._28_4_ = 0;
        auVar32._4_4_ = -auVar145._4_4_ * fVar104;
        auVar32._0_4_ = -auVar145._0_4_ * fVar89;
        auVar32._8_4_ = -auVar145._8_4_ * fVar105;
        auVar32._12_4_ = -auVar145._12_4_ * fVar106;
        auVar32._16_4_ = -auVar145._16_4_ * 0.0;
        auVar32._20_4_ = -auVar145._20_4_ * 0.0;
        auVar32._24_4_ = -auVar145._24_4_ * 0.0;
        auVar32._28_4_ = auVar177._28_4_;
        auVar33._28_4_ = auVar11._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * 0.0,
                                CONCAT48(fVar105 * 0.0,CONCAT44(fVar104 * 0.0,fVar89 * 0.0))));
        auVar18 = vfmadd213ps_fma(auVar132,ZEXT1632(auVar19),auVar158);
        auVar145 = ZEXT1632(auVar19);
        auVar21 = vfmadd213ps_fma(auVar29,auVar145,auVar97);
        auVar22 = vfmadd213ps_fma(auVar30,auVar145,ZEXT1632(auVar23));
        auVar112 = vfnmadd213ps_fma(auVar132,auVar145,auVar158);
        auVar94 = vfmadd213ps_fma(auVar188,ZEXT1632(auVar20),auVar114);
        auVar92 = vfnmadd213ps_fma(auVar29,auVar145,auVar97);
        auVar145 = ZEXT1632(auVar20);
        auVar93 = vfmadd213ps_fma(auVar32,auVar145,auVar129);
        local_740 = ZEXT1632(auVar19);
        auVar142 = vfnmadd231ps_fma(ZEXT1632(auVar23),local_740,auVar30);
        auVar19 = vfmadd213ps_fma(auVar33,auVar145,_local_400);
        auVar113 = vfnmadd213ps_fma(auVar188,auVar145,auVar114);
        auVar134 = vfnmadd213ps_fma(auVar32,auVar145,auVar129);
        auVar91 = vfnmadd231ps_fma(_local_400,ZEXT1632(auVar20),auVar33);
        auVar145 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar92));
        auVar11 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar142));
        auVar97._4_4_ = auVar142._4_4_ * auVar145._4_4_;
        auVar97._0_4_ = auVar142._0_4_ * auVar145._0_4_;
        auVar97._8_4_ = auVar142._8_4_ * auVar145._8_4_;
        auVar97._12_4_ = auVar142._12_4_ * auVar145._12_4_;
        auVar97._16_4_ = auVar145._16_4_ * 0.0;
        auVar97._20_4_ = auVar145._20_4_ * 0.0;
        auVar97._24_4_ = auVar145._24_4_ * 0.0;
        auVar97._28_4_ = 0;
        auVar124 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar92),auVar11);
        auVar114._4_4_ = auVar11._4_4_ * auVar112._4_4_;
        auVar114._0_4_ = auVar11._0_4_ * auVar112._0_4_;
        auVar114._8_4_ = auVar11._8_4_ * auVar112._8_4_;
        auVar114._12_4_ = auVar11._12_4_ * auVar112._12_4_;
        auVar114._16_4_ = auVar11._16_4_ * 0.0;
        auVar114._20_4_ = auVar11._20_4_ * 0.0;
        auVar114._24_4_ = auVar11._24_4_ * 0.0;
        auVar114._28_4_ = auVar11._28_4_;
        auVar11 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar112));
        auVar23 = vfmsub231ps_fma(auVar114,ZEXT1632(auVar142),auVar11);
        auVar129._4_4_ = auVar92._4_4_ * auVar11._4_4_;
        auVar129._0_4_ = auVar92._0_4_ * auVar11._0_4_;
        auVar129._8_4_ = auVar92._8_4_ * auVar11._8_4_;
        auVar129._12_4_ = auVar92._12_4_ * auVar11._12_4_;
        auVar129._16_4_ = auVar11._16_4_ * 0.0;
        auVar129._20_4_ = auVar11._20_4_ * 0.0;
        auVar129._24_4_ = auVar11._24_4_ * 0.0;
        auVar129._28_4_ = auVar11._28_4_;
        auVar119 = ZEXT1632(auVar112);
        auVar112 = vfmsub231ps_fma(auVar129,auVar119,auVar145);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar124));
        auVar103 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,2);
        local_620 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar18),auVar103);
        auVar145 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar21),auVar103);
        local_560 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar22),auVar103);
        auVar11 = vblendvps_avx(auVar119,ZEXT1632(auVar94),auVar103);
        auVar161 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar93),auVar103);
        auVar96 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar19),auVar103);
        auVar119 = vblendvps_avx(ZEXT1632(auVar94),auVar119,auVar103);
        auVar177 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar92),auVar103);
        auVar23 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
        _local_760 = ZEXT1632(auVar23);
        auVar12 = vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar142),auVar103);
        auVar24 = vsubps_avx(auVar119,local_620);
        auVar132 = vsubps_avx(auVar177,auVar145);
        auVar98 = vsubps_avx(auVar12,local_560);
        auVar195 = vsubps_avx(local_620,auVar11);
        auVar201 = vsubps_avx(auVar145,auVar161);
        auVar202 = vsubps_avx(local_560,auVar96);
        auVar158._4_4_ = auVar98._4_4_ * local_620._4_4_;
        auVar158._0_4_ = auVar98._0_4_ * local_620._0_4_;
        auVar158._8_4_ = auVar98._8_4_ * local_620._8_4_;
        auVar158._12_4_ = auVar98._12_4_ * local_620._12_4_;
        auVar158._16_4_ = auVar98._16_4_ * local_620._16_4_;
        auVar158._20_4_ = auVar98._20_4_ * local_620._20_4_;
        auVar158._24_4_ = auVar98._24_4_ * local_620._24_4_;
        auVar158._28_4_ = auVar12._28_4_;
        auVar18 = vfmsub231ps_fma(auVar158,local_560,auVar24);
        auVar34._4_4_ = auVar24._4_4_ * auVar145._4_4_;
        auVar34._0_4_ = auVar24._0_4_ * auVar145._0_4_;
        auVar34._8_4_ = auVar24._8_4_ * auVar145._8_4_;
        auVar34._12_4_ = auVar24._12_4_ * auVar145._12_4_;
        auVar34._16_4_ = auVar24._16_4_ * auVar145._16_4_;
        auVar34._20_4_ = auVar24._20_4_ * auVar145._20_4_;
        auVar34._24_4_ = auVar24._24_4_ * auVar145._24_4_;
        auVar34._28_4_ = auVar119._28_4_;
        auVar19 = vfmsub231ps_fma(auVar34,local_620,auVar132);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar100._0_4_ = auVar132._0_4_ * local_560._0_4_;
        auVar100._4_4_ = auVar132._4_4_ * local_560._4_4_;
        auVar100._8_4_ = auVar132._8_4_ * local_560._8_4_;
        auVar100._12_4_ = auVar132._12_4_ * local_560._12_4_;
        auVar100._16_4_ = auVar132._16_4_ * local_560._16_4_;
        auVar100._20_4_ = auVar132._20_4_ * local_560._20_4_;
        auVar100._24_4_ = auVar132._24_4_ * local_560._24_4_;
        auVar100._28_4_ = 0;
        auVar19 = vfmsub231ps_fma(auVar100,auVar145,auVar98);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar101._0_4_ = auVar202._0_4_ * auVar11._0_4_;
        auVar101._4_4_ = auVar202._4_4_ * auVar11._4_4_;
        auVar101._8_4_ = auVar202._8_4_ * auVar11._8_4_;
        auVar101._12_4_ = auVar202._12_4_ * auVar11._12_4_;
        auVar101._16_4_ = auVar202._16_4_ * auVar11._16_4_;
        auVar101._20_4_ = auVar202._20_4_ * auVar11._20_4_;
        auVar101._24_4_ = auVar202._24_4_ * auVar11._24_4_;
        auVar101._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar101,auVar195,auVar96);
        auVar35._4_4_ = auVar201._4_4_ * auVar96._4_4_;
        auVar35._0_4_ = auVar201._0_4_ * auVar96._0_4_;
        auVar35._8_4_ = auVar201._8_4_ * auVar96._8_4_;
        auVar35._12_4_ = auVar201._12_4_ * auVar96._12_4_;
        auVar35._16_4_ = auVar201._16_4_ * auVar96._16_4_;
        auVar35._20_4_ = auVar201._20_4_ * auVar96._20_4_;
        auVar35._24_4_ = auVar201._24_4_ * auVar96._24_4_;
        auVar35._28_4_ = auVar96._28_4_;
        auVar21 = vfmsub231ps_fma(auVar35,auVar161,auVar202);
        auVar36._4_4_ = auVar195._4_4_ * auVar161._4_4_;
        auVar36._0_4_ = auVar195._0_4_ * auVar161._0_4_;
        auVar36._8_4_ = auVar195._8_4_ * auVar161._8_4_;
        auVar36._12_4_ = auVar195._12_4_ * auVar161._12_4_;
        auVar36._16_4_ = auVar195._16_4_ * auVar161._16_4_;
        auVar36._20_4_ = auVar195._20_4_ * auVar161._20_4_;
        auVar36._24_4_ = auVar195._24_4_ * auVar161._24_4_;
        auVar36._28_4_ = auVar177._28_4_;
        auVar22 = vfmsub231ps_fma(auVar36,auVar201,auVar11);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar155 = ZEXT1664(auVar21);
        auVar11 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar21));
        auVar11 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,2);
        auVar18 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
        auVar23 = vpand_avx(auVar18,auVar23);
        auVar11 = vpmovsxwd_avx2(auVar23);
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0x7f,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0xbf,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar11[0x1f]) {
LAB_016f2676:
          auVar166 = ZEXT3264(CONCAT824(uStack_408,
                                        CONCAT816(uStack_410,CONCAT88(uStack_418,local_420))));
          auVar207._8_4_ = local_4e0;
          auVar207._0_8_ = uVar90;
          auVar207._12_4_ = fStack_4dc;
          auVar207._16_4_ = local_4e0;
          auVar207._20_4_ = fStack_4dc;
          auVar207._24_4_ = local_4e0;
          auVar207._28_4_ = fStack_4dc;
        }
        else {
          auVar37._4_4_ = auVar132._4_4_ * auVar202._4_4_;
          auVar37._0_4_ = auVar132._0_4_ * auVar202._0_4_;
          auVar37._8_4_ = auVar132._8_4_ * auVar202._8_4_;
          auVar37._12_4_ = auVar132._12_4_ * auVar202._12_4_;
          auVar37._16_4_ = auVar132._16_4_ * auVar202._16_4_;
          auVar37._20_4_ = auVar132._20_4_ * auVar202._20_4_;
          auVar37._24_4_ = auVar132._24_4_ * auVar202._24_4_;
          auVar37._28_4_ = auVar11._28_4_;
          auVar93 = vfmsub231ps_fma(auVar37,auVar201,auVar98);
          auVar117._0_4_ = auVar98._0_4_ * auVar195._0_4_;
          auVar117._4_4_ = auVar98._4_4_ * auVar195._4_4_;
          auVar117._8_4_ = auVar98._8_4_ * auVar195._8_4_;
          auVar117._12_4_ = auVar98._12_4_ * auVar195._12_4_;
          auVar117._16_4_ = auVar98._16_4_ * auVar195._16_4_;
          auVar117._20_4_ = auVar98._20_4_ * auVar195._20_4_;
          auVar117._24_4_ = auVar98._24_4_ * auVar195._24_4_;
          auVar117._28_4_ = 0;
          auVar94 = vfmsub231ps_fma(auVar117,auVar24,auVar202);
          auVar38._4_4_ = auVar24._4_4_ * auVar201._4_4_;
          auVar38._0_4_ = auVar24._0_4_ * auVar201._0_4_;
          auVar38._8_4_ = auVar24._8_4_ * auVar201._8_4_;
          auVar38._12_4_ = auVar24._12_4_ * auVar201._12_4_;
          auVar38._16_4_ = auVar24._16_4_ * auVar201._16_4_;
          auVar38._20_4_ = auVar24._20_4_ * auVar201._20_4_;
          auVar38._24_4_ = auVar24._24_4_ * auVar201._24_4_;
          auVar38._28_4_ = auVar161._28_4_;
          auVar124 = vfmsub231ps_fma(auVar38,auVar195,auVar132);
          auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar124));
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar93),_DAT_02020f00);
          auVar11 = vrcpps_avx(ZEXT1632(auVar22));
          auVar189._8_4_ = 0x3f800000;
          auVar189._0_8_ = &DAT_3f8000003f800000;
          auVar189._12_4_ = 0x3f800000;
          auVar189._16_4_ = 0x3f800000;
          auVar189._20_4_ = 0x3f800000;
          auVar189._24_4_ = 0x3f800000;
          auVar189._28_4_ = 0x3f800000;
          auVar18 = vfnmadd213ps_fma(auVar11,ZEXT1632(auVar22),auVar189);
          auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar11,auVar11);
          auVar160._0_4_ = auVar124._0_4_ * local_560._0_4_;
          auVar160._4_4_ = auVar124._4_4_ * local_560._4_4_;
          auVar160._8_4_ = auVar124._8_4_ * local_560._8_4_;
          auVar160._12_4_ = auVar124._12_4_ * local_560._12_4_;
          auVar160._16_4_ = local_560._16_4_ * 0.0;
          auVar160._20_4_ = local_560._20_4_ * 0.0;
          auVar160._24_4_ = local_560._24_4_ * 0.0;
          auVar160._28_4_ = 0;
          auVar94 = vfmadd231ps_fma(auVar160,auVar145,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar93),local_620);
          fVar104 = auVar18._0_4_;
          fVar105 = auVar18._4_4_;
          fVar106 = auVar18._8_4_;
          fVar107 = auVar18._12_4_;
          auVar161 = ZEXT1632(CONCAT412(fVar107 * auVar94._12_4_,
                                        CONCAT48(fVar106 * auVar94._8_4_,
                                                 CONCAT44(fVar105 * auVar94._4_4_,
                                                          fVar104 * auVar94._0_4_))));
          auVar102._4_4_ = uVar81;
          auVar102._0_4_ = uVar81;
          auVar102._8_4_ = uVar81;
          auVar102._12_4_ = uVar81;
          auVar102._16_4_ = uVar81;
          auVar102._20_4_ = uVar81;
          auVar102._24_4_ = uVar81;
          auVar102._28_4_ = uVar81;
          fVar89 = ray->tfar;
          auVar118._4_4_ = fVar89;
          auVar118._0_4_ = fVar89;
          auVar118._8_4_ = fVar89;
          auVar118._12_4_ = fVar89;
          auVar118._16_4_ = fVar89;
          auVar118._20_4_ = fVar89;
          auVar118._24_4_ = fVar89;
          auVar118._28_4_ = fVar89;
          auVar145 = vcmpps_avx(auVar102,auVar161,2);
          auVar11 = vcmpps_avx(auVar161,auVar118,2);
          auVar145 = vandps_avx(auVar11,auVar145);
          auVar18 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
          auVar23 = vpand_avx(auVar23,auVar18);
          auVar145 = vpmovsxwd_avx2(auVar23);
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0x7f,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0xbf,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar145[0x1f]) goto LAB_016f2676;
          auVar145 = vcmpps_avx(ZEXT1632(auVar22),ZEXT832(0) << 0x20,4);
          auVar18 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
          auVar23 = vpand_avx(auVar23,auVar18);
          auVar145 = vpmovsxwd_avx2(auVar23);
          auVar166 = ZEXT3264(CONCAT824(uStack_408,
                                        CONCAT816(uStack_410,CONCAT88(uStack_418,local_420))));
          auVar207._8_4_ = local_4e0;
          auVar207._0_8_ = uVar90;
          auVar207._12_4_ = fStack_4dc;
          auVar207._16_4_ = local_4e0;
          auVar207._20_4_ = fStack_4dc;
          auVar207._24_4_ = local_4e0;
          auVar207._28_4_ = fStack_4dc;
          if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar145 >> 0x7f,0) != '\0') ||
                (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0xbf,0) != '\0') ||
              (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar145[0x1f] < '\0') {
            auVar96 = ZEXT1632(CONCAT412(fVar107 * auVar19._12_4_,
                                         CONCAT48(fVar106 * auVar19._8_4_,
                                                  CONCAT44(fVar105 * auVar19._4_4_,
                                                           fVar104 * auVar19._0_4_))));
            auVar119 = ZEXT1632(CONCAT412(fVar107 * auVar21._12_4_,
                                          CONCAT48(fVar106 * auVar21._8_4_,
                                                   CONCAT44(fVar105 * auVar21._4_4_,
                                                            fVar104 * auVar21._0_4_))));
            auVar144._8_4_ = 0x3f800000;
            auVar144._0_8_ = &DAT_3f8000003f800000;
            auVar144._12_4_ = 0x3f800000;
            auVar144._16_4_ = 0x3f800000;
            auVar144._20_4_ = 0x3f800000;
            auVar144._24_4_ = 0x3f800000;
            auVar144._28_4_ = 0x3f800000;
            auVar11 = vsubps_avx(auVar144,auVar96);
            _local_160 = vblendvps_avx(auVar11,auVar96,auVar103);
            auVar11 = vsubps_avx(auVar144,auVar119);
            local_340 = vblendvps_avx(auVar11,auVar119,auVar103);
            auVar166 = ZEXT3264(auVar145);
            local_2a0 = auVar161;
          }
        }
        auVar211 = ZEXT3264(local_6a0);
        auVar145 = auVar166._0_32_;
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar145 >> 0x7f,0) != '\0') ||
              (auVar166 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar145 >> 0xbf,0) != '\0') ||
            (auVar166 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar166[0x1f] < '\0') {
          auVar11 = vsubps_avx(ZEXT1632(auVar20),local_740);
          auVar23 = vfmadd213ps_fma(auVar11,_local_160,local_740);
          fVar89 = pre->depth_scale;
          auVar39._4_4_ = (auVar23._4_4_ + auVar23._4_4_) * fVar89;
          auVar39._0_4_ = (auVar23._0_4_ + auVar23._0_4_) * fVar89;
          auVar39._8_4_ = (auVar23._8_4_ + auVar23._8_4_) * fVar89;
          auVar39._12_4_ = (auVar23._12_4_ + auVar23._12_4_) * fVar89;
          auVar39._16_4_ = fVar89 * 0.0;
          auVar39._20_4_ = fVar89 * 0.0;
          auVar39._24_4_ = fVar89 * 0.0;
          auVar39._28_4_ = 0;
          auVar166 = ZEXT3264(local_2a0);
          auVar11 = vcmpps_avx(local_2a0,auVar39,6);
          auVar161 = auVar145 & auVar11;
          auVar203 = ZEXT3264(local_5c0);
          auVar171 = ZEXT3264(local_5e0);
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar161 >> 0x7f,0) != '\0') ||
                (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar161 >> 0xbf,0) != '\0') ||
              (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar161[0x1f] < '\0') {
            local_220 = vandps_avx(auVar11,auVar145);
            auVar120._8_4_ = 0xbf800000;
            auVar120._0_8_ = 0xbf800000bf800000;
            auVar120._12_4_ = 0xbf800000;
            auVar120._16_4_ = 0xbf800000;
            auVar120._20_4_ = 0xbf800000;
            auVar120._24_4_ = 0xbf800000;
            auVar120._28_4_ = 0xbf800000;
            auVar131._8_4_ = 0x40000000;
            auVar131._0_8_ = 0x4000000040000000;
            auVar131._12_4_ = 0x40000000;
            auVar131._16_4_ = 0x40000000;
            auVar131._20_4_ = 0x40000000;
            auVar131._24_4_ = 0x40000000;
            auVar131._28_4_ = 0x40000000;
            auVar23 = vfmadd213ps_fma(local_340,auVar131,auVar120);
            local_2e0 = _local_160;
            local_2c0 = ZEXT1632(auVar23);
            local_280 = 0;
            local_27c = iVar14;
            local_270 = *(undefined8 *)*pauVar1;
            uStack_268 = *(undefined8 *)(*pauVar1 + 8);
            local_260 = *(undefined8 *)*pauVar2;
            uStack_258 = *(undefined8 *)(*pauVar2 + 8);
            local_250 = *(undefined8 *)*pauVar3;
            uStack_248 = *(undefined8 *)(*pauVar3 + 8);
            local_240 = *(undefined8 *)*pauVar4;
            uStack_238 = *(undefined8 *)(*pauVar4 + 8);
            auVar198 = ZEXT3264(_local_480);
            local_340 = ZEXT1632(auVar23);
            auVar145 = local_340;
            if ((pGVar15->mask & ray->mask) == 0) {
              uVar84 = 0;
              auVar140 = ZEXT3264(local_680);
              auVar178 = ZEXT3264(auVar207);
              auVar209 = ZEXT3264(local_6e0);
            }
            else {
              auVar140 = ZEXT3264(local_680);
              auVar178 = ZEXT3264(auVar207);
              auVar209 = ZEXT3264(local_6e0);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar84 = CONCAT71((int7)(uVar84 >> 8),1),
                 pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar123 = 1.0 / auVar99._0_4_;
                local_200[0] = fVar123 * ((float)local_160._0_4_ + 0.0);
                local_200[1] = fVar123 * ((float)local_160._4_4_ + 1.0);
                local_200[2] = fVar123 * (fStack_158 + 2.0);
                local_200[3] = fVar123 * (fStack_154 + 3.0);
                fStack_1f0 = fVar123 * (fStack_150 + 4.0);
                fStack_1ec = fVar123 * (fStack_14c + 5.0);
                fStack_1e8 = fVar123 * (fStack_148 + 6.0);
                fStack_1e4 = fStack_144 + 7.0;
                local_340._0_8_ = auVar23._0_8_;
                local_340._8_8_ = auVar23._8_8_;
                local_1e0 = local_340._0_8_;
                uStack_1d8 = local_340._8_8_;
                uStack_1d0 = 0;
                uStack_1c8 = 0;
                local_1c0 = local_2a0;
                uVar81 = vmovmskps_avx(local_220);
                uVar84 = CONCAT71((int7)(uVar84 >> 8),uVar81 != 0);
                local_340 = auVar145;
                if (uVar81 != 0) {
                  lVar87 = 0;
                  auVar85 = (undefined1  [8])(ulong)(uVar81 & 0xff);
                  for (uVar82 = (ulong)auVar85; (uVar82 & 1) == 0;
                      uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                    lVar87 = lVar87 + 1;
                  }
                  local_500 = ZEXT1632(*pauVar2);
                  local_440 = ZEXT1632(*pauVar3);
                  _local_520 = ZEXT1632(*pauVar4);
                  local_6c0 = local_2a0;
                  local_770 = context;
                  local_768 = ray;
                  local_6f0 = pre;
                  do {
                    local_594 = local_200[lVar87];
                    local_590 = *(undefined4 *)((long)&local_1e0 + lVar87 * 4);
                    local_560._0_4_ = ray->tfar;
                    local_620._0_8_ = lVar87;
                    ray->tfar = *(float *)(local_1c0 + lVar87 * 4);
                    local_650.context = context->user;
                    fVar89 = 1.0 - local_594;
                    fVar123 = fVar89 * fVar89 * -3.0;
                    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * fVar89)),
                                              ZEXT416((uint)(local_594 * fVar89)),
                                              ZEXT416(0xc0000000));
                    auVar18 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar89)),
                                              ZEXT416((uint)(local_594 * local_594)),
                                              ZEXT416(0x40000000));
                    fVar89 = auVar23._0_4_ * 3.0;
                    fVar104 = auVar18._0_4_ * 3.0;
                    fVar105 = local_594 * local_594 * 3.0;
                    auVar149._0_4_ = fVar105 * (float)local_520._0_4_;
                    auVar149._4_4_ = fVar105 * (float)local_520._4_4_;
                    auVar149._8_4_ = fVar105 * (float)uStack_518;
                    auVar149._12_4_ = fVar105 * uStack_518._4_4_;
                    auVar155 = ZEXT1664(auVar149);
                    auVar125._4_4_ = fVar104;
                    auVar125._0_4_ = fVar104;
                    auVar125._8_4_ = fVar104;
                    auVar125._12_4_ = fVar104;
                    auVar23 = vfmadd132ps_fma(auVar125,auVar149,local_440._0_16_);
                    auVar135._4_4_ = fVar89;
                    auVar135._0_4_ = fVar89;
                    auVar135._8_4_ = fVar89;
                    auVar135._12_4_ = fVar89;
                    auVar23 = vfmadd132ps_fma(auVar135,auVar23,local_500._0_16_);
                    auVar126._4_4_ = fVar123;
                    auVar126._0_4_ = fVar123;
                    auVar126._8_4_ = fVar123;
                    auVar126._12_4_ = fVar123;
                    auVar74._8_8_ = uStack_658;
                    auVar74._0_8_ = local_660;
                    auVar23 = vfmadd132ps_fma(auVar126,auVar23,auVar74);
                    local_5a0 = vmovlps_avx(auVar23);
                    local_598 = vextractps_avx(auVar23,2);
                    local_58c = (int)local_568;
                    local_588 = (int)local_6e8;
                    local_584 = (local_650.context)->instID[0];
                    local_580 = (local_650.context)->instPrimID[0];
                    local_774 = -1;
                    local_650.valid = &local_774;
                    local_650.geometryUserPtr = pGVar15->userPtr;
                    local_650.ray = (RTCRayN *)ray;
                    local_650.hit = (RTCHitN *)&local_5a0;
                    local_650.N = 1;
                    local_740._0_4_ = (int)uVar84;
                    local_760 = auVar85;
                    if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016f17e0:
                      p_Var17 = context->args->filter;
                      if (p_Var17 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                        auVar155 = ZEXT1664(auVar155._0_16_);
                        (*p_Var17)(&local_650);
                        uVar84 = (ulong)(uint)local_740._0_4_;
                        auVar198 = ZEXT3264(_local_480);
                        auVar203 = ZEXT3264(local_5c0);
                        auVar211 = ZEXT3264(local_6a0);
                        auVar209 = ZEXT3264(local_6e0);
                        auVar178 = ZEXT3264(CONCAT428(fStack_4c4,
                                                      CONCAT424(fStack_4c8,
                                                                CONCAT420(fStack_4cc,
                                                                          CONCAT416(fStack_4d0,
                                                                                    CONCAT412(
                                                  fStack_4d4,
                                                  CONCAT48(fStack_4d8,CONCAT44(fStack_4dc,local_4e0)
                                                          )))))));
                        auVar171 = ZEXT3264(local_5e0);
                        auVar166 = ZEXT3264(local_6c0);
                        ray = local_768;
                        context = local_770;
                        auVar85 = local_760;
                        pre = local_6f0;
                      }
                      if (*local_650.valid != 0) break;
                    }
                    else {
                      auVar155 = ZEXT1664(auVar149);
                      (*pGVar15->occlusionFilterN)(&local_650);
                      uVar84 = (ulong)(uint)local_740._0_4_;
                      auVar198 = ZEXT3264(_local_480);
                      auVar203 = ZEXT3264(local_5c0);
                      auVar211 = ZEXT3264(local_6a0);
                      auVar209 = ZEXT3264(local_6e0);
                      auVar178 = ZEXT3264(CONCAT428(fStack_4c4,
                                                    CONCAT424(fStack_4c8,
                                                              CONCAT420(fStack_4cc,
                                                                        CONCAT416(fStack_4d0,
                                                                                  CONCAT412(
                                                  fStack_4d4,
                                                  CONCAT48(fStack_4d8,CONCAT44(fStack_4dc,local_4e0)
                                                          )))))));
                      auVar171 = ZEXT3264(local_5e0);
                      auVar166 = ZEXT3264(local_6c0);
                      ray = local_768;
                      context = local_770;
                      auVar85 = local_760;
                      pre = local_6f0;
                      if (*local_650.valid != 0) goto LAB_016f17e0;
                    }
                    ray->tfar = (float)local_560._0_4_;
                    lVar87 = 0;
                    auVar85 = (undefined1  [8])((ulong)auVar85 ^ 1L << (local_620._0_8_ & 0x3f));
                    for (uVar82 = (ulong)auVar85; (uVar82 & 1) == 0;
                        uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                      lVar87 = lVar87 + 1;
                    }
                    uVar84 = CONCAT71((int7)(uVar84 >> 8),auVar85 != (undefined1  [8])0x0);
                  } while (auVar85 != (undefined1  [8])0x0);
                }
                uVar84 = uVar84 & 0xffffffffffffff01;
                auVar140 = ZEXT3264(local_680);
                fVar123 = (float)local_720._0_4_;
              }
            }
            auVar122 = ZEXT3264(local_600);
            goto LAB_016f13f8;
          }
        }
        auVar203 = ZEXT3264(local_5c0);
        auVar166 = ZEXT3264(local_2a0);
        uVar84 = 0;
        auVar209 = ZEXT3264(local_6e0);
        auVar178 = ZEXT3264(auVar207);
        auVar171 = ZEXT3264(local_5e0);
        auVar140 = ZEXT3264(local_680);
        auVar122 = ZEXT3264(local_600);
        auVar198 = ZEXT3264(_local_480);
      }
LAB_016f13f8:
      local_768 = ray;
      local_770 = context;
      local_6f0 = pre;
      if (8 < iVar14) {
        local_5c0 = auVar203._0_32_;
        local_3c0._4_4_ = iVar14;
        local_3c0._0_4_ = iVar14;
        fStack_3b8 = (float)iVar14;
        fStack_3b4 = (float)iVar14;
        fStack_3b0 = (float)iVar14;
        fStack_3ac = (float)iVar14;
        fStack_3a8 = (float)iVar14;
        iStack_3a4 = iVar14;
        local_320._4_4_ = fVar123;
        local_320._0_4_ = fVar123;
        fStack_318 = fVar123;
        fStack_314 = fVar123;
        fStack_310 = fVar123;
        fStack_30c = fVar123;
        fStack_308 = fVar123;
        fStack_304 = fVar123;
        local_100 = local_460._0_4_;
        uStack_fc = local_460._0_4_;
        uStack_f8 = local_460._0_4_;
        uStack_f4 = local_460._0_4_;
        uStack_f0 = local_460._0_4_;
        uStack_ec = local_460._0_4_;
        uStack_e8 = local_460._0_4_;
        uStack_e4 = local_460._0_4_;
        local_120 = 1.0 / (float)local_380._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar87 = 8;
        local_6c0 = auVar166._0_32_;
        _local_480 = auVar198._0_32_;
        do {
          local_720._0_32_ = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar25);
          auVar145 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar87 * 4);
          local_460 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar87 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar25 + 0x2228070 + lVar87 * 4);
          auVar78 = *pauVar5;
          auVar199._0_4_ = local_540 * *(float *)*pauVar5;
          auVar199._4_4_ = fStack_53c * *(float *)(*pauVar5 + 4);
          auVar199._8_4_ = fStack_538 * *(float *)(*pauVar5 + 8);
          auVar199._12_4_ = fStack_534 * *(float *)(*pauVar5 + 0xc);
          auVar199._16_4_ = fStack_530 * *(float *)(*pauVar5 + 0x10);
          auVar199._20_4_ = fStack_52c * *(float *)(*pauVar5 + 0x14);
          auVar199._28_36_ = auVar198._28_36_;
          auVar199._24_4_ = fStack_528 * *(float *)(*pauVar5 + 0x18);
          fVar172 = auVar178._0_4_;
          auVar198._0_4_ = fVar172 * *(float *)*pauVar5;
          fVar179 = auVar178._4_4_;
          auVar198._4_4_ = fVar179 * *(float *)(*pauVar5 + 4);
          fVar180 = auVar178._8_4_;
          auVar198._8_4_ = fVar180 * *(float *)(*pauVar5 + 8);
          fVar181 = auVar178._12_4_;
          auVar198._12_4_ = fVar181 * *(float *)(*pauVar5 + 0xc);
          fVar182 = auVar178._16_4_;
          auVar198._16_4_ = fVar182 * *(float *)(*pauVar5 + 0x10);
          fVar183 = auVar178._20_4_;
          auVar198._20_4_ = fVar183 * *(float *)(*pauVar5 + 0x14);
          auVar198._28_36_ = auVar155._28_36_;
          fVar184 = auVar178._24_4_;
          auVar198._24_4_ = fVar184 * *(float *)(*pauVar5 + 0x18);
          auVar23 = vfmadd231ps_fma(auVar199._0_32_,local_460,auVar140._0_32_);
          auVar18 = vfmadd231ps_fma(auVar198._0_32_,local_460,auVar171._0_32_);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar145,auVar209._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar145,auVar122._0_32_);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_720._0_32_,auVar211._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_720._0_32_,local_3a0);
          auVar11 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar25);
          auVar161 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar87 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar87 * 4);
          pfVar6 = (float *)(lVar25 + 0x222a490 + lVar87 * 4);
          fVar109 = *pfVar6;
          fVar193 = pfVar6[1];
          fVar200 = pfVar6[2];
          fVar70 = pfVar6[3];
          fVar71 = pfVar6[4];
          fVar72 = pfVar6[5];
          fVar73 = pfVar6[6];
          auVar155._0_4_ = fVar109 * local_540;
          auVar155._4_4_ = fVar193 * fStack_53c;
          auVar155._8_4_ = fVar200 * fStack_538;
          auVar155._12_4_ = fVar70 * fStack_534;
          auVar155._16_4_ = fVar71 * fStack_530;
          auVar155._20_4_ = fVar72 * fStack_52c;
          auVar155._28_36_ = auVar203._28_36_;
          auVar155._24_4_ = fVar73 * fStack_528;
          auVar40._4_4_ = fVar179 * fVar193;
          auVar40._0_4_ = fVar172 * fVar109;
          auVar40._8_4_ = fVar180 * fVar200;
          auVar40._12_4_ = fVar181 * fVar70;
          auVar40._16_4_ = fVar182 * fVar71;
          auVar40._20_4_ = fVar183 * fVar72;
          auVar40._24_4_ = fVar184 * fVar73;
          auVar40._28_4_ = local_720._28_4_;
          auVar19 = vfmadd231ps_fma(auVar155._0_32_,auVar96,auVar140._0_32_);
          auVar20 = vfmadd231ps_fma(auVar40,auVar96,auVar171._0_32_);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar161,auVar209._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar161,auVar122._0_32_);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,auVar211._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar11,local_3a0);
          auVar201 = ZEXT1632(auVar19);
          auVar195 = ZEXT1632(auVar23);
          auVar177 = vsubps_avx(auVar201,auVar195);
          auVar132 = ZEXT1632(auVar20);
          auVar98 = ZEXT1632(auVar18);
          auVar12 = vsubps_avx(auVar132,auVar98);
          auVar41._4_4_ = auVar177._4_4_ * auVar18._4_4_;
          auVar41._0_4_ = auVar177._0_4_ * auVar18._0_4_;
          auVar41._8_4_ = auVar177._8_4_ * auVar18._8_4_;
          auVar41._12_4_ = auVar177._12_4_ * auVar18._12_4_;
          auVar41._16_4_ = auVar177._16_4_ * 0.0;
          auVar41._20_4_ = auVar177._20_4_ * 0.0;
          auVar41._24_4_ = auVar177._24_4_ * 0.0;
          auVar41._28_4_ = auVar171._28_4_;
          fVar123 = auVar12._0_4_;
          auVar166._0_4_ = auVar23._0_4_ * fVar123;
          fVar89 = auVar12._4_4_;
          auVar166._4_4_ = auVar23._4_4_ * fVar89;
          fVar104 = auVar12._8_4_;
          auVar166._8_4_ = auVar23._8_4_ * fVar104;
          fVar105 = auVar12._12_4_;
          auVar166._12_4_ = auVar23._12_4_ * fVar105;
          fVar106 = auVar12._16_4_;
          auVar166._16_4_ = fVar106 * 0.0;
          fVar107 = auVar12._20_4_;
          auVar166._20_4_ = fVar107 * 0.0;
          fVar108 = auVar12._24_4_;
          auVar166._28_36_ = auVar122._28_36_;
          auVar166._24_4_ = fVar108 * 0.0;
          auVar198 = ZEXT3264(local_460);
          auVar103 = vsubps_avx(auVar41,auVar166._0_32_);
          local_760._0_4_ = auVar78._0_4_;
          local_760._4_4_ = auVar78._4_4_;
          fStack_758 = auVar78._8_4_;
          fStack_754 = auVar78._12_4_;
          fStack_750 = auVar78._16_4_;
          fStack_74c = auVar78._20_4_;
          fStack_748 = auVar78._24_4_;
          auVar42._4_4_ = local_e0._4_4_ * (float)local_760._4_4_;
          auVar42._0_4_ = (float)local_e0 * (float)local_760._0_4_;
          auVar42._8_4_ = (float)uStack_d8 * fStack_758;
          auVar42._12_4_ = uStack_d8._4_4_ * fStack_754;
          auVar42._16_4_ = (float)uStack_d0 * fStack_750;
          auVar42._20_4_ = uStack_d0._4_4_ * fStack_74c;
          auVar42._24_4_ = (float)uStack_c8 * fStack_748;
          auVar42._28_4_ = auVar122._28_4_;
          auVar155 = ZEXT3264(auVar161);
          auVar23 = vfmadd231ps_fma(auVar42,local_460,local_c0);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_a0,auVar145);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_80,local_720._0_32_);
          auVar43._4_4_ = local_e0._4_4_ * fVar193;
          auVar43._0_4_ = (float)local_e0 * fVar109;
          auVar43._8_4_ = (float)uStack_d8 * fVar200;
          auVar43._12_4_ = uStack_d8._4_4_ * fVar70;
          auVar43._16_4_ = (float)uStack_d0 * fVar71;
          auVar43._20_4_ = uStack_d0._4_4_ * fVar72;
          auVar43._24_4_ = (float)uStack_c8 * fVar73;
          auVar43._28_4_ = uStack_c8._4_4_;
          auVar18 = vfmadd231ps_fma(auVar43,auVar96,local_c0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar161,local_a0);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar11,local_80);
          auVar203 = ZEXT1664(auVar18);
          auVar211._0_4_ = fVar123 * fVar123;
          auVar211._4_4_ = fVar89 * fVar89;
          auVar211._8_4_ = fVar104 * fVar104;
          auVar211._12_4_ = fVar105 * fVar105;
          auVar211._16_4_ = fVar106 * fVar106;
          auVar211._20_4_ = fVar107 * fVar107;
          auVar211._28_36_ = auVar178._28_36_;
          auVar211._24_4_ = fVar108 * fVar108;
          auVar21 = vfmadd231ps_fma(auVar211._0_32_,auVar177,auVar177);
          _local_400 = ZEXT1632(auVar23);
          auVar202 = ZEXT1632(auVar18);
          auVar119 = vmaxps_avx(_local_400,auVar202);
          auVar174._0_4_ = auVar119._0_4_ * auVar119._0_4_ * auVar21._0_4_;
          auVar174._4_4_ = auVar119._4_4_ * auVar119._4_4_ * auVar21._4_4_;
          auVar174._8_4_ = auVar119._8_4_ * auVar119._8_4_ * auVar21._8_4_;
          auVar174._12_4_ = auVar119._12_4_ * auVar119._12_4_ * auVar21._12_4_;
          auVar174._16_4_ = auVar119._16_4_ * auVar119._16_4_ * 0.0;
          auVar174._20_4_ = auVar119._20_4_ * auVar119._20_4_ * 0.0;
          auVar174._24_4_ = auVar119._24_4_ * auVar119._24_4_ * 0.0;
          auVar174._28_4_ = 0;
          auVar44._4_4_ = auVar103._4_4_ * auVar103._4_4_;
          auVar44._0_4_ = auVar103._0_4_ * auVar103._0_4_;
          auVar44._8_4_ = auVar103._8_4_ * auVar103._8_4_;
          auVar44._12_4_ = auVar103._12_4_ * auVar103._12_4_;
          auVar44._16_4_ = auVar103._16_4_ * auVar103._16_4_;
          auVar44._20_4_ = auVar103._20_4_ * auVar103._20_4_;
          auVar44._24_4_ = auVar103._24_4_ * auVar103._24_4_;
          auVar44._28_4_ = auVar103._28_4_;
          auVar119 = vcmpps_avx(auVar44,auVar174,2);
          local_280 = (int)lVar87;
          auVar175._4_4_ = local_280;
          auVar175._0_4_ = local_280;
          auVar175._8_4_ = local_280;
          auVar175._12_4_ = local_280;
          auVar175._16_4_ = local_280;
          auVar175._20_4_ = local_280;
          auVar175._24_4_ = local_280;
          auVar175._28_4_ = local_280;
          auVar103 = vpor_avx2(auVar175,_DAT_0205a920);
          auVar24 = vpcmpgtd_avx2(_local_3c0,auVar103);
          auVar103 = auVar24 & auVar119;
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0x7f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0xbf,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar103[0x1f]) {
            auVar122 = ZEXT3264(local_600);
            auVar140 = ZEXT3264(local_680);
            auVar171 = ZEXT3264(local_5e0);
            auVar178 = ZEXT3264(auVar178._0_32_);
            auVar209 = ZEXT3264(local_6e0);
            auVar211 = ZEXT3264(local_6a0);
            auVar166 = ZEXT3264(local_6c0);
          }
          else {
            local_380 = vandps_avx(auVar24,auVar119);
            auVar45._4_4_ = fVar193 * (float)local_480._4_4_;
            auVar45._0_4_ = fVar109 * (float)local_480._0_4_;
            auVar45._8_4_ = fVar200 * fStack_478;
            auVar45._12_4_ = fVar70 * fStack_474;
            auVar45._16_4_ = fVar71 * fStack_470;
            auVar45._20_4_ = fVar72 * fStack_46c;
            auVar45._24_4_ = fVar73 * fStack_468;
            auVar45._28_4_ = auVar119._28_4_;
            auVar23 = vfmadd213ps_fma(auVar96,local_140,auVar45);
            auVar23 = vfmadd213ps_fma(auVar161,local_5c0,ZEXT1632(auVar23));
            auVar23 = vfmadd132ps_fma(auVar11,ZEXT1632(auVar23),local_3e0);
            auVar46._4_4_ = (float)local_480._4_4_ * (float)local_760._4_4_;
            auVar46._0_4_ = (float)local_480._0_4_ * (float)local_760._0_4_;
            auVar46._8_4_ = fStack_478 * fStack_758;
            auVar46._12_4_ = fStack_474 * fStack_754;
            auVar46._16_4_ = fStack_470 * fStack_750;
            auVar46._20_4_ = fStack_46c * fStack_74c;
            auVar46._24_4_ = fStack_468 * fStack_748;
            auVar46._28_4_ = auVar119._28_4_;
            auVar21 = vfmadd213ps_fma(local_460,local_140,auVar46);
            auVar21 = vfmadd213ps_fma(auVar145,local_5c0,ZEXT1632(auVar21));
            auVar145 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar87 * 4);
            auVar11 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar87 * 4);
            auVar161 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar87 * 4);
            pfVar7 = (float *)(lVar25 + 0x2229280 + lVar87 * 4);
            fVar123 = *pfVar7;
            fVar89 = pfVar7[1];
            fVar104 = pfVar7[2];
            fVar105 = pfVar7[3];
            fVar106 = pfVar7[4];
            fVar107 = pfVar7[5];
            fVar108 = pfVar7[6];
            auVar47._4_4_ = fVar89 * fStack_53c;
            auVar47._0_4_ = fVar123 * local_540;
            auVar47._8_4_ = fVar104 * fStack_538;
            auVar47._12_4_ = fVar105 * fStack_534;
            auVar47._16_4_ = fVar106 * fStack_530;
            auVar47._20_4_ = fVar107 * fStack_52c;
            auVar47._24_4_ = fVar108 * fStack_528;
            auVar47._28_4_ = pfVar6[7];
            auVar196._0_4_ = fVar123 * fVar172;
            auVar196._4_4_ = fVar89 * fVar179;
            auVar196._8_4_ = fVar104 * fVar180;
            auVar196._12_4_ = fVar105 * fVar181;
            auVar196._16_4_ = fVar106 * fVar182;
            auVar196._20_4_ = fVar107 * fVar183;
            auVar196._24_4_ = fVar108 * fVar184;
            auVar196._28_4_ = 0;
            auVar48._4_4_ = fVar89 * (float)local_480._4_4_;
            auVar48._0_4_ = fVar123 * (float)local_480._0_4_;
            auVar48._8_4_ = fVar104 * fStack_478;
            auVar48._12_4_ = fVar105 * fStack_474;
            auVar48._16_4_ = fVar106 * fStack_470;
            auVar48._20_4_ = fVar107 * fStack_46c;
            auVar48._24_4_ = fVar108 * fStack_468;
            auVar48._28_4_ = pfVar7[7];
            auVar22 = vfmadd231ps_fma(auVar47,auVar161,local_680);
            auVar94 = vfmadd231ps_fma(auVar196,auVar161,local_5e0);
            auVar93 = vfmadd231ps_fma(auVar48,local_140,auVar161);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,local_6e0);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar11,local_600);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_5c0,auVar11);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar145,local_6a0);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar145,local_3a0);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar145,local_3e0);
            pfVar6 = (float *)(lVar25 + 0x222b6a0 + lVar87 * 4);
            fVar123 = *pfVar6;
            fVar89 = pfVar6[1];
            fVar104 = pfVar6[2];
            fVar105 = pfVar6[3];
            fVar106 = pfVar6[4];
            fVar107 = pfVar6[5];
            fVar108 = pfVar6[6];
            local_460 = auVar177;
            auVar49._4_4_ = fStack_53c * fVar89;
            auVar49._0_4_ = local_540 * fVar123;
            auVar49._8_4_ = fStack_538 * fVar104;
            auVar49._12_4_ = fStack_534 * fVar105;
            auVar49._16_4_ = fStack_530 * fVar106;
            auVar49._20_4_ = fStack_52c * fVar107;
            auVar49._24_4_ = fStack_528 * fVar108;
            auVar49._28_4_ = auVar177._28_4_;
            auVar50._4_4_ = fVar179 * fVar89;
            auVar50._0_4_ = fVar172 * fVar123;
            auVar50._8_4_ = fVar180 * fVar104;
            auVar50._12_4_ = fVar181 * fVar105;
            auVar50._16_4_ = fVar182 * fVar106;
            auVar50._20_4_ = fVar183 * fVar107;
            auVar50._24_4_ = fVar184 * fVar108;
            auVar50._28_4_ = auVar12._28_4_;
            auVar51._4_4_ = fVar89 * (float)local_480._4_4_;
            auVar51._0_4_ = fVar123 * (float)local_480._0_4_;
            auVar51._8_4_ = fVar104 * fStack_478;
            auVar51._12_4_ = fVar105 * fStack_474;
            auVar51._16_4_ = fVar106 * fStack_470;
            auVar51._20_4_ = fVar107 * fStack_46c;
            auVar51._24_4_ = fVar108 * fStack_468;
            auVar51._28_4_ = pfVar6[7];
            auVar145 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar87 * 4);
            auVar124 = vfmadd231ps_fma(auVar49,auVar145,local_680);
            auVar112 = vfmadd231ps_fma(auVar50,auVar145,local_5e0);
            auVar92 = vfmadd231ps_fma(auVar51,local_140,auVar145);
            auVar145 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar87 * 4);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar145,local_6e0);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar145,local_600);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar145,local_5c0);
            auVar145 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar87 * 4);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar145,local_6a0);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar145,local_3a0);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_3e0,auVar145);
            auVar176._8_4_ = 0x7fffffff;
            auVar176._0_8_ = 0x7fffffff7fffffff;
            auVar176._12_4_ = 0x7fffffff;
            auVar176._16_4_ = 0x7fffffff;
            auVar176._20_4_ = 0x7fffffff;
            auVar176._24_4_ = 0x7fffffff;
            auVar176._28_4_ = 0x7fffffff;
            auVar145 = vandps_avx(ZEXT1632(auVar22),auVar176);
            auVar11 = vandps_avx(ZEXT1632(auVar94),auVar176);
            auVar11 = vmaxps_avx(auVar145,auVar11);
            auVar145 = vandps_avx(ZEXT1632(auVar93),auVar176);
            auVar145 = vmaxps_avx(auVar11,auVar145);
            auVar145 = vcmpps_avx(auVar145,_local_320,1);
            auVar161 = vblendvps_avx(ZEXT1632(auVar22),auVar177,auVar145);
            auVar96 = vblendvps_avx(ZEXT1632(auVar94),auVar12,auVar145);
            auVar145 = vandps_avx(ZEXT1632(auVar124),auVar176);
            auVar11 = vandps_avx(ZEXT1632(auVar112),auVar176);
            auVar11 = vmaxps_avx(auVar145,auVar11);
            auVar145 = vandps_avx(auVar176,ZEXT1632(auVar92));
            auVar145 = vmaxps_avx(auVar11,auVar145);
            auVar11 = vcmpps_avx(auVar145,_local_320,1);
            auVar145 = vblendvps_avx(ZEXT1632(auVar124),auVar177,auVar11);
            auVar11 = vblendvps_avx(ZEXT1632(auVar112),auVar12,auVar11);
            auVar21 = vfmadd213ps_fma(local_720._0_32_,local_3e0,ZEXT1632(auVar21));
            auVar22 = vfmadd213ps_fma(auVar161,auVar161,ZEXT832(0) << 0x20);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar96,auVar96);
            auVar119 = vrsqrtps_avx(ZEXT1632(auVar22));
            fVar123 = auVar119._0_4_;
            fVar89 = auVar119._4_4_;
            fVar104 = auVar119._8_4_;
            fVar105 = auVar119._12_4_;
            fVar106 = auVar119._16_4_;
            fVar107 = auVar119._20_4_;
            fVar108 = auVar119._24_4_;
            auVar52._4_4_ = fVar89 * fVar89 * fVar89 * auVar22._4_4_ * -0.5;
            auVar52._0_4_ = fVar123 * fVar123 * fVar123 * auVar22._0_4_ * -0.5;
            auVar52._8_4_ = fVar104 * fVar104 * fVar104 * auVar22._8_4_ * -0.5;
            auVar52._12_4_ = fVar105 * fVar105 * fVar105 * auVar22._12_4_ * -0.5;
            auVar52._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
            auVar52._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
            auVar52._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
            auVar52._28_4_ = 0;
            auVar208._8_4_ = 0x3fc00000;
            auVar208._0_8_ = 0x3fc000003fc00000;
            auVar208._12_4_ = 0x3fc00000;
            auVar208._16_4_ = 0x3fc00000;
            auVar208._20_4_ = 0x3fc00000;
            auVar208._24_4_ = 0x3fc00000;
            auVar208._28_4_ = 0x3fc00000;
            auVar22 = vfmadd231ps_fma(auVar52,auVar208,auVar119);
            fVar123 = auVar22._0_4_;
            fVar89 = auVar22._4_4_;
            auVar53._4_4_ = auVar96._4_4_ * fVar89;
            auVar53._0_4_ = auVar96._0_4_ * fVar123;
            fVar104 = auVar22._8_4_;
            auVar53._8_4_ = auVar96._8_4_ * fVar104;
            fVar105 = auVar22._12_4_;
            auVar53._12_4_ = auVar96._12_4_ * fVar105;
            auVar53._16_4_ = auVar96._16_4_ * 0.0;
            auVar53._20_4_ = auVar96._20_4_ * 0.0;
            auVar53._24_4_ = auVar96._24_4_ * 0.0;
            auVar53._28_4_ = auVar119._28_4_;
            auVar54._4_4_ = fVar89 * -auVar161._4_4_;
            auVar54._0_4_ = fVar123 * -auVar161._0_4_;
            auVar54._8_4_ = fVar104 * -auVar161._8_4_;
            auVar54._12_4_ = fVar105 * -auVar161._12_4_;
            auVar54._16_4_ = -auVar161._16_4_ * 0.0;
            auVar54._20_4_ = -auVar161._20_4_ * 0.0;
            auVar54._24_4_ = -auVar161._24_4_ * 0.0;
            auVar54._28_4_ = auVar96._28_4_;
            auVar22 = vfmadd213ps_fma(auVar145,auVar145,ZEXT832(0) << 0x20);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,auVar11);
            auVar161 = vrsqrtps_avx(ZEXT1632(auVar22));
            auVar55._28_4_ = local_3a0._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar105 * 0.0,
                                    CONCAT48(fVar104 * 0.0,CONCAT44(fVar89 * 0.0,fVar123 * 0.0))));
            fVar123 = auVar161._0_4_;
            fVar89 = auVar161._4_4_;
            fVar104 = auVar161._8_4_;
            fVar105 = auVar161._12_4_;
            fVar106 = auVar161._16_4_;
            fVar107 = auVar161._20_4_;
            fVar108 = auVar161._24_4_;
            auVar56._4_4_ = fVar89 * fVar89 * fVar89 * auVar22._4_4_ * -0.5;
            auVar56._0_4_ = fVar123 * fVar123 * fVar123 * auVar22._0_4_ * -0.5;
            auVar56._8_4_ = fVar104 * fVar104 * fVar104 * auVar22._8_4_ * -0.5;
            auVar56._12_4_ = fVar105 * fVar105 * fVar105 * auVar22._12_4_ * -0.5;
            auVar56._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
            auVar56._20_4_ = fVar107 * fVar107 * fVar107 * -0.0;
            auVar56._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
            auVar56._28_4_ = 0;
            auVar22 = vfmadd231ps_fma(auVar56,auVar208,auVar161);
            fVar123 = auVar22._0_4_;
            fVar89 = auVar22._4_4_;
            auVar57._4_4_ = auVar11._4_4_ * fVar89;
            auVar57._0_4_ = auVar11._0_4_ * fVar123;
            fVar104 = auVar22._8_4_;
            auVar57._8_4_ = auVar11._8_4_ * fVar104;
            fVar105 = auVar22._12_4_;
            auVar57._12_4_ = auVar11._12_4_ * fVar105;
            auVar57._16_4_ = auVar11._16_4_ * 0.0;
            auVar57._20_4_ = auVar11._20_4_ * 0.0;
            auVar57._24_4_ = auVar11._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar89 * -auVar145._4_4_;
            auVar58._0_4_ = fVar123 * -auVar145._0_4_;
            auVar58._8_4_ = fVar104 * -auVar145._8_4_;
            auVar58._12_4_ = fVar105 * -auVar145._12_4_;
            auVar58._16_4_ = -auVar145._16_4_ * 0.0;
            auVar58._20_4_ = -auVar145._20_4_ * 0.0;
            auVar58._24_4_ = -auVar145._24_4_ * 0.0;
            auVar58._28_4_ = auVar161._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar105 * 0.0,
                                    CONCAT48(fVar104 * 0.0,CONCAT44(fVar89 * 0.0,fVar123 * 0.0))));
            auVar22 = vfmadd213ps_fma(auVar53,_local_400,auVar195);
            auVar94 = vfmadd213ps_fma(auVar54,_local_400,auVar98);
            auVar93 = vfmadd213ps_fma(auVar55,_local_400,ZEXT1632(auVar21));
            auVar113 = vfnmadd213ps_fma(auVar53,_local_400,auVar195);
            auVar124 = vfmadd213ps_fma(auVar57,auVar202,auVar201);
            auVar134 = vfnmadd213ps_fma(auVar54,_local_400,auVar98);
            auVar112 = vfmadd213ps_fma(auVar58,auVar202,auVar132);
            auVar111 = vfnmadd231ps_fma(ZEXT1632(auVar21),_local_400,auVar55);
            auVar21 = vfmadd213ps_fma(auVar59,auVar202,ZEXT1632(auVar23));
            auVar142 = vfnmadd213ps_fma(auVar57,auVar202,auVar201);
            auVar91 = vfnmadd213ps_fma(auVar58,auVar202,auVar132);
            auVar141 = vfnmadd231ps_fma(ZEXT1632(auVar23),auVar202,auVar59);
            auVar145 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar134));
            auVar11 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar111));
            auVar60._4_4_ = auVar145._4_4_ * auVar111._4_4_;
            auVar60._0_4_ = auVar145._0_4_ * auVar111._0_4_;
            auVar60._8_4_ = auVar145._8_4_ * auVar111._8_4_;
            auVar60._12_4_ = auVar145._12_4_ * auVar111._12_4_;
            auVar60._16_4_ = auVar145._16_4_ * 0.0;
            auVar60._20_4_ = auVar145._20_4_ * 0.0;
            auVar60._24_4_ = auVar145._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar134),auVar11);
            auVar61._4_4_ = auVar113._4_4_ * auVar11._4_4_;
            auVar61._0_4_ = auVar113._0_4_ * auVar11._0_4_;
            auVar61._8_4_ = auVar113._8_4_ * auVar11._8_4_;
            auVar61._12_4_ = auVar113._12_4_ * auVar11._12_4_;
            auVar61._16_4_ = auVar11._16_4_ * 0.0;
            auVar61._20_4_ = auVar11._20_4_ * 0.0;
            auVar61._24_4_ = auVar11._24_4_ * 0.0;
            auVar61._28_4_ = auVar11._28_4_;
            auVar177 = ZEXT1632(auVar113);
            auVar11 = vsubps_avx(ZEXT1632(auVar124),auVar177);
            auVar103 = ZEXT1632(auVar111);
            auVar23 = vfmsub231ps_fma(auVar61,auVar103,auVar11);
            auVar62._4_4_ = auVar134._4_4_ * auVar11._4_4_;
            auVar62._0_4_ = auVar134._0_4_ * auVar11._0_4_;
            auVar62._8_4_ = auVar134._8_4_ * auVar11._8_4_;
            auVar62._12_4_ = auVar134._12_4_ * auVar11._12_4_;
            auVar62._16_4_ = auVar11._16_4_ * 0.0;
            auVar62._20_4_ = auVar11._20_4_ * 0.0;
            auVar62._24_4_ = auVar11._24_4_ * 0.0;
            auVar62._28_4_ = auVar11._28_4_;
            auVar113 = vfmsub231ps_fma(auVar62,auVar177,auVar145);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar92));
            auVar24 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,2);
            auVar145 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar22),auVar24);
            auVar11 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar94),auVar24);
            local_720._0_32_ = vblendvps_avx(ZEXT1632(auVar141),ZEXT1632(auVar93),auVar24);
            auVar161 = vblendvps_avx(auVar177,ZEXT1632(auVar124),auVar24);
            auVar96 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar112),auVar24);
            auVar119 = vblendvps_avx(auVar103,ZEXT1632(auVar21),auVar24);
            auVar177 = vblendvps_avx(ZEXT1632(auVar124),auVar177,auVar24);
            auVar12 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar134),auVar24);
            auVar23 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
            auVar103 = vblendvps_avx(ZEXT1632(auVar21),auVar103,auVar24);
            auVar177 = vsubps_avx(auVar177,auVar145);
            auVar12 = vsubps_avx(auVar12,auVar11);
            auVar132 = vsubps_avx(auVar103,local_720._0_32_);
            auVar198 = ZEXT3264(auVar132);
            auVar98 = vsubps_avx(auVar145,auVar161);
            auVar195 = vsubps_avx(auVar11,auVar96);
            auVar201 = vsubps_avx(local_720._0_32_,auVar119);
            auVar203 = ZEXT3264(auVar201);
            auVar152._0_4_ = auVar132._0_4_ * auVar145._0_4_;
            auVar152._4_4_ = auVar132._4_4_ * auVar145._4_4_;
            auVar152._8_4_ = auVar132._8_4_ * auVar145._8_4_;
            auVar152._12_4_ = auVar132._12_4_ * auVar145._12_4_;
            auVar152._16_4_ = auVar132._16_4_ * auVar145._16_4_;
            auVar152._20_4_ = auVar132._20_4_ * auVar145._20_4_;
            auVar152._24_4_ = auVar132._24_4_ * auVar145._24_4_;
            auVar152._28_4_ = 0;
            auVar21 = vfmsub231ps_fma(auVar152,local_720._0_32_,auVar177);
            auVar63._4_4_ = auVar177._4_4_ * auVar11._4_4_;
            auVar63._0_4_ = auVar177._0_4_ * auVar11._0_4_;
            auVar63._8_4_ = auVar177._8_4_ * auVar11._8_4_;
            auVar63._12_4_ = auVar177._12_4_ * auVar11._12_4_;
            auVar63._16_4_ = auVar177._16_4_ * auVar11._16_4_;
            auVar63._20_4_ = auVar177._20_4_ * auVar11._20_4_;
            auVar63._24_4_ = auVar177._24_4_ * auVar11._24_4_;
            auVar63._28_4_ = auVar103._28_4_;
            auVar22 = vfmsub231ps_fma(auVar63,auVar145,auVar12);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar21),_DAT_02020f00);
            auVar153._0_4_ = local_720._0_4_ * auVar12._0_4_;
            auVar153._4_4_ = local_720._4_4_ * auVar12._4_4_;
            auVar153._8_4_ = local_720._8_4_ * auVar12._8_4_;
            auVar153._12_4_ = local_720._12_4_ * auVar12._12_4_;
            auVar153._16_4_ = local_720._16_4_ * auVar12._16_4_;
            auVar153._20_4_ = local_720._20_4_ * auVar12._20_4_;
            auVar153._24_4_ = local_720._24_4_ * auVar12._24_4_;
            auVar153._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar153,auVar11,auVar132);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
            auVar154._0_4_ = auVar201._0_4_ * auVar161._0_4_;
            auVar154._4_4_ = auVar201._4_4_ * auVar161._4_4_;
            auVar154._8_4_ = auVar201._8_4_ * auVar161._8_4_;
            auVar154._12_4_ = auVar201._12_4_ * auVar161._12_4_;
            auVar154._16_4_ = auVar201._16_4_ * auVar161._16_4_;
            auVar154._20_4_ = auVar201._20_4_ * auVar161._20_4_;
            auVar154._24_4_ = auVar201._24_4_ * auVar161._24_4_;
            auVar154._28_4_ = 0;
            auVar21 = vfmsub231ps_fma(auVar154,auVar98,auVar119);
            auVar64._4_4_ = auVar195._4_4_ * auVar119._4_4_;
            auVar64._0_4_ = auVar195._0_4_ * auVar119._0_4_;
            auVar64._8_4_ = auVar195._8_4_ * auVar119._8_4_;
            auVar64._12_4_ = auVar195._12_4_ * auVar119._12_4_;
            auVar64._16_4_ = auVar195._16_4_ * auVar119._16_4_;
            auVar64._20_4_ = auVar195._20_4_ * auVar119._20_4_;
            auVar64._24_4_ = auVar195._24_4_ * auVar119._24_4_;
            auVar64._28_4_ = auVar119._28_4_;
            auVar94 = vfmsub231ps_fma(auVar64,auVar96,auVar201);
            auVar65._4_4_ = auVar98._4_4_ * auVar96._4_4_;
            auVar65._0_4_ = auVar98._0_4_ * auVar96._0_4_;
            auVar65._8_4_ = auVar98._8_4_ * auVar96._8_4_;
            auVar65._12_4_ = auVar98._12_4_ * auVar96._12_4_;
            auVar65._16_4_ = auVar98._16_4_ * auVar96._16_4_;
            auVar65._20_4_ = auVar98._20_4_ * auVar96._20_4_;
            auVar65._24_4_ = auVar98._24_4_ * auVar96._24_4_;
            auVar65._28_4_ = auVar96._28_4_;
            auVar93 = vfmsub231ps_fma(auVar65,auVar195,auVar161);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar94));
            auVar161 = vmaxps_avx(ZEXT1632(auVar22),ZEXT1632(auVar94));
            auVar161 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,2);
            auVar21 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
            auVar23 = vpand_avx(auVar23,auVar21);
            auVar161 = vpmovsxwd_avx2(auVar23);
            auVar155 = ZEXT3264(auVar161);
            if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar161 >> 0x7f,0) == '\0') &&
                  (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar161 >> 0xbf,0) == '\0') &&
                (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar161[0x1f]) {
LAB_016f263e:
              auVar139._8_8_ = uStack_418;
              auVar139._0_8_ = local_420;
              auVar139._16_8_ = uStack_410;
              auVar139._24_8_ = uStack_408;
            }
            else {
              auVar66._4_4_ = auVar201._4_4_ * auVar12._4_4_;
              auVar66._0_4_ = auVar201._0_4_ * auVar12._0_4_;
              auVar66._8_4_ = auVar201._8_4_ * auVar12._8_4_;
              auVar66._12_4_ = auVar201._12_4_ * auVar12._12_4_;
              auVar66._16_4_ = auVar201._16_4_ * auVar12._16_4_;
              auVar66._20_4_ = auVar201._20_4_ * auVar12._20_4_;
              auVar66._24_4_ = auVar201._24_4_ * auVar12._24_4_;
              auVar66._28_4_ = auVar161._28_4_;
              auVar112 = vfmsub231ps_fma(auVar66,auVar195,auVar132);
              auVar162._0_4_ = auVar132._0_4_ * auVar98._0_4_;
              auVar162._4_4_ = auVar132._4_4_ * auVar98._4_4_;
              auVar162._8_4_ = auVar132._8_4_ * auVar98._8_4_;
              auVar162._12_4_ = auVar132._12_4_ * auVar98._12_4_;
              auVar162._16_4_ = auVar132._16_4_ * auVar98._16_4_;
              auVar162._20_4_ = auVar132._20_4_ * auVar98._20_4_;
              auVar162._24_4_ = auVar132._24_4_ * auVar98._24_4_;
              auVar162._28_4_ = 0;
              auVar124 = vfmsub231ps_fma(auVar162,auVar177,auVar201);
              auVar67._4_4_ = auVar177._4_4_ * auVar195._4_4_;
              auVar67._0_4_ = auVar177._0_4_ * auVar195._0_4_;
              auVar67._8_4_ = auVar177._8_4_ * auVar195._8_4_;
              auVar67._12_4_ = auVar177._12_4_ * auVar195._12_4_;
              auVar67._16_4_ = auVar177._16_4_ * auVar195._16_4_;
              auVar67._20_4_ = auVar177._20_4_ * auVar195._20_4_;
              auVar67._24_4_ = auVar177._24_4_ * auVar195._24_4_;
              auVar67._28_4_ = auVar195._28_4_;
              auVar92 = vfmsub231ps_fma(auVar67,auVar98,auVar12);
              auVar21 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar124),ZEXT1632(auVar92));
              auVar93 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar112),ZEXT832(0) << 0x20);
              auVar161 = vrcpps_avx(ZEXT1632(auVar93));
              auVar197._8_4_ = 0x3f800000;
              auVar197._0_8_ = &DAT_3f8000003f800000;
              auVar197._12_4_ = 0x3f800000;
              auVar197._16_4_ = 0x3f800000;
              auVar197._20_4_ = 0x3f800000;
              auVar197._24_4_ = 0x3f800000;
              auVar197._28_4_ = 0x3f800000;
              auVar198 = ZEXT3264(auVar197);
              auVar21 = vfnmadd213ps_fma(auVar161,ZEXT1632(auVar93),auVar197);
              auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar161,auVar161);
              auVar137._0_4_ = auVar92._0_4_ * local_720._0_4_;
              auVar137._4_4_ = auVar92._4_4_ * local_720._4_4_;
              auVar137._8_4_ = auVar92._8_4_ * local_720._8_4_;
              auVar137._12_4_ = auVar92._12_4_ * local_720._12_4_;
              auVar137._16_4_ = local_720._16_4_ * 0.0;
              auVar137._20_4_ = local_720._20_4_ * 0.0;
              auVar137._24_4_ = local_720._24_4_ * 0.0;
              auVar137._28_4_ = 0;
              auVar124 = vfmadd231ps_fma(auVar137,ZEXT1632(auVar124),auVar11);
              auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar145,ZEXT1632(auVar112));
              fVar89 = auVar21._0_4_;
              fVar104 = auVar21._4_4_;
              fVar105 = auVar21._8_4_;
              fVar106 = auVar21._12_4_;
              auVar96 = ZEXT1632(CONCAT412(fVar106 * auVar124._12_4_,
                                           CONCAT48(fVar105 * auVar124._8_4_,
                                                    CONCAT44(fVar104 * auVar124._4_4_,
                                                             fVar89 * auVar124._0_4_))));
              auVar155 = ZEXT3264(auVar96);
              fVar123 = local_768->tfar;
              auVar138._4_4_ = fVar123;
              auVar138._0_4_ = fVar123;
              auVar138._8_4_ = fVar123;
              auVar138._12_4_ = fVar123;
              auVar138._16_4_ = fVar123;
              auVar138._20_4_ = fVar123;
              auVar138._24_4_ = fVar123;
              auVar138._28_4_ = fVar123;
              auVar77._4_4_ = uStack_fc;
              auVar77._0_4_ = local_100;
              auVar77._8_4_ = uStack_f8;
              auVar77._12_4_ = uStack_f4;
              auVar77._16_4_ = uStack_f0;
              auVar77._20_4_ = uStack_ec;
              auVar77._24_4_ = uStack_e8;
              auVar77._28_4_ = uStack_e4;
              auVar145 = vcmpps_avx(auVar77,auVar96,2);
              auVar161 = vcmpps_avx(auVar96,auVar138,2);
              auVar145 = vandps_avx(auVar161,auVar145);
              auVar21 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
              auVar23 = vpand_avx(auVar23,auVar21);
              auVar145 = vpmovsxwd_avx2(auVar23);
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar145 >> 0x7f,0) == '\0') &&
                    (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar145 >> 0xbf,0) == '\0') &&
                  (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar145[0x1f]) goto LAB_016f263e;
              auVar145 = vcmpps_avx(ZEXT1632(auVar93),ZEXT832(0) << 0x20,4);
              auVar21 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
              auVar23 = vpand_avx(auVar23,auVar21);
              auVar145 = vpmovsxwd_avx2(auVar23);
              auVar139._8_8_ = uStack_418;
              auVar139._0_8_ = local_420;
              auVar139._16_8_ = uStack_410;
              auVar139._24_8_ = uStack_408;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                auVar119 = ZEXT1632(CONCAT412(fVar106 * auVar22._12_4_,
                                              CONCAT48(fVar105 * auVar22._8_4_,
                                                       CONCAT44(fVar104 * auVar22._4_4_,
                                                                fVar89 * auVar22._0_4_))));
                auVar68._28_4_ = SUB84(uStack_408,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar106 * auVar94._12_4_,
                                        CONCAT48(fVar105 * auVar94._8_4_,
                                                 CONCAT44(fVar104 * auVar94._4_4_,
                                                          fVar89 * auVar94._0_4_))));
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = &DAT_3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar161 = vsubps_avx(auVar170,auVar119);
                _local_180 = vblendvps_avx(auVar161,auVar119,auVar24);
                auVar161 = vsubps_avx(auVar170,auVar68);
                local_360 = vblendvps_avx(auVar161,auVar68,auVar24);
                local_1a0 = auVar96;
                auVar139 = auVar145;
              }
            }
            auVar211 = ZEXT3264(local_6a0);
            auVar209 = ZEXT3264(local_6e0);
            auVar76._4_4_ = fStack_4dc;
            auVar76._0_4_ = local_4e0;
            auVar76._8_4_ = fStack_4d8;
            auVar76._12_4_ = fStack_4d4;
            auVar76._16_4_ = fStack_4d0;
            auVar76._20_4_ = fStack_4cc;
            auVar76._24_4_ = fStack_4c8;
            auVar76._28_4_ = fStack_4c4;
            if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar139 >> 0x7f,0) != '\0') ||
                  (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar139 >> 0xbf,0) != '\0') ||
                (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar139[0x1f] < '\0') {
              auVar145 = vsubps_avx(auVar202,_local_400);
              auVar23 = vfmadd213ps_fma(auVar145,_local_180,_local_400);
              fVar123 = local_6f0->depth_scale;
              auVar69._4_4_ = (auVar23._4_4_ + auVar23._4_4_) * fVar123;
              auVar69._0_4_ = (auVar23._0_4_ + auVar23._0_4_) * fVar123;
              auVar69._8_4_ = (auVar23._8_4_ + auVar23._8_4_) * fVar123;
              auVar69._12_4_ = (auVar23._12_4_ + auVar23._12_4_) * fVar123;
              auVar69._16_4_ = fVar123 * 0.0;
              auVar69._20_4_ = fVar123 * 0.0;
              auVar69._24_4_ = fVar123 * 0.0;
              auVar69._28_4_ = fVar123;
              auVar155 = ZEXT3264(local_1a0);
              auVar145 = vcmpps_avx(local_1a0,auVar69,6);
              auVar161 = auVar139 & auVar145;
              auVar171 = ZEXT3264(local_5e0);
              if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar161 >> 0x7f,0) != '\0') ||
                    (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar161 >> 0xbf,0) != '\0') ||
                  (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar161[0x1f] < '\0') {
                local_220 = vandps_avx(auVar145,auVar139);
                auVar121._8_4_ = 0xbf800000;
                auVar121._0_8_ = 0xbf800000bf800000;
                auVar121._12_4_ = 0xbf800000;
                auVar121._16_4_ = 0xbf800000;
                auVar121._20_4_ = 0xbf800000;
                auVar121._24_4_ = 0xbf800000;
                auVar121._28_4_ = 0xbf800000;
                auVar133._8_4_ = 0x40000000;
                auVar133._0_8_ = 0x4000000040000000;
                auVar133._12_4_ = 0x40000000;
                auVar133._16_4_ = 0x40000000;
                auVar133._20_4_ = 0x40000000;
                auVar133._24_4_ = 0x40000000;
                auVar133._28_4_ = 0x40000000;
                auVar23 = vfmadd213ps_fma(local_360,auVar133,auVar121);
                local_2e0 = _local_180;
                local_2c0 = ZEXT1632(auVar23);
                local_2a0 = local_1a0;
                local_27c = iVar14;
                local_270 = local_660;
                uStack_268 = uStack_658;
                local_260 = local_490;
                uStack_258 = uStack_488;
                local_250 = local_4a0;
                uStack_248 = uStack_498;
                local_240 = local_4b0;
                uStack_238 = uStack_4a8;
                pGVar15 = (local_770->scene->geometries).items[local_6e8].ptr;
                auVar178 = ZEXT3264(auVar76);
                local_360 = ZEXT1632(auVar23);
                auVar145 = local_360;
                if ((pGVar15->mask & local_768->mask) == 0) {
                  bVar80 = 0;
                  auVar122 = ZEXT3264(local_600);
                  auVar166 = ZEXT3264(local_6c0);
                }
                else {
                  auVar122 = ZEXT3264(local_600);
                  if (local_770->args->filter == (RTCFilterFunctionN)0x0) {
                    auVar166 = ZEXT3264(local_6c0);
                    bVar80 = 1;
                    if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_016f262d;
                  }
                  local_620 = ZEXT1632(CONCAT88(auVar20._8_8_,pGVar15));
                  local_740._4_28_ = auVar11._4_28_;
                  local_740._0_4_ = (int)uVar84;
                  auVar203 = ZEXT864(0);
                  fVar123 = (float)local_280;
                  local_200[0] = (fVar123 + (float)local_180._0_4_ + 0.0) * local_120;
                  local_200[1] = (fVar123 + (float)local_180._4_4_ + 1.0) * fStack_11c;
                  local_200[2] = (fVar123 + fStack_178 + 2.0) * fStack_118;
                  local_200[3] = (fVar123 + fStack_174 + 3.0) * fStack_114;
                  fStack_1f0 = (fVar123 + fStack_170 + 4.0) * fStack_110;
                  fStack_1ec = (fVar123 + fStack_16c + 5.0) * fStack_10c;
                  fStack_1e8 = (fVar123 + fStack_168 + 6.0) * fStack_108;
                  fStack_1e4 = fVar123 + fStack_164 + 7.0;
                  local_360._0_8_ = auVar23._0_8_;
                  local_360._8_8_ = auVar23._8_8_;
                  local_1e0 = local_360._0_8_;
                  uStack_1d8 = local_360._8_8_;
                  uStack_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1c0 = local_1a0;
                  uVar81 = vmovmskps_avx(local_220);
                  local_560 = ZEXT1632(CONCAT124(auVar19._4_12_,
                                                 (int)CONCAT71((int7)((ulong)pGVar15 >> 8),
                                                               uVar81 != 0)));
                  local_360 = auVar145;
                  if (uVar81 != 0) {
                    uVar82 = (ulong)(uVar81 & 0xff);
                    _local_760 = ZEXT1632(CONCAT88(auVar18._8_8_,uVar82));
                    lVar26 = 0;
                    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                      lVar26 = lVar26 + 1;
                    }
                    local_720._0_8_ = lVar26;
                    local_500._0_16_ = CONCAT88(uStack_488,local_490);
                    local_500 = ZEXT1632(local_500._0_16_);
                    local_440._0_16_ = CONCAT88(uStack_498,local_4a0);
                    local_440 = ZEXT1632(local_440._0_16_);
                    _local_520 = ZEXT1632(CONCAT88(uStack_4a8,local_4b0));
                    do {
                      local_594 = local_200[local_720._0_8_];
                      local_590 = *(undefined4 *)((long)&local_1e0 + local_720._0_8_ * 4);
                      local_460._0_4_ = local_768->tfar;
                      local_768->tfar = *(float *)(local_1c0 + local_720._0_8_ * 4);
                      local_650.context = local_770->user;
                      fVar89 = 1.0 - local_594;
                      fVar123 = fVar89 * fVar89 * -3.0;
                      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * fVar89)),
                                                ZEXT416((uint)(local_594 * fVar89)),
                                                ZEXT416(0xc0000000));
                      auVar18 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar89)),
                                                ZEXT416((uint)(local_594 * local_594)),
                                                ZEXT416(0x40000000));
                      fVar89 = auVar23._0_4_ * 3.0;
                      fVar104 = auVar18._0_4_ * 3.0;
                      fVar105 = local_594 * local_594 * 3.0;
                      auVar150._0_4_ = fVar105 * (float)local_520._0_4_;
                      auVar150._4_4_ = fVar105 * (float)local_520._4_4_;
                      auVar150._8_4_ = fVar105 * (float)uStack_518;
                      auVar150._12_4_ = fVar105 * uStack_518._4_4_;
                      auVar155 = ZEXT1664(auVar150);
                      auVar127._4_4_ = fVar104;
                      auVar127._0_4_ = fVar104;
                      auVar127._8_4_ = fVar104;
                      auVar127._12_4_ = fVar104;
                      auVar23 = vfmadd132ps_fma(auVar127,auVar150,local_440._0_16_);
                      auVar136._4_4_ = fVar89;
                      auVar136._0_4_ = fVar89;
                      auVar136._8_4_ = fVar89;
                      auVar136._12_4_ = fVar89;
                      auVar23 = vfmadd132ps_fma(auVar136,auVar23,local_500._0_16_);
                      auVar128._4_4_ = fVar123;
                      auVar128._0_4_ = fVar123;
                      auVar128._8_4_ = fVar123;
                      auVar128._12_4_ = fVar123;
                      auVar75._8_8_ = uStack_658;
                      auVar75._0_8_ = local_660;
                      auVar23 = vfmadd132ps_fma(auVar128,auVar23,auVar75);
                      local_5a0 = vmovlps_avx(auVar23);
                      local_598 = vextractps_avx(auVar23,2);
                      local_58c = (int)local_568;
                      local_588 = (int)local_6e8;
                      local_584 = (local_650.context)->instID[0];
                      local_580 = (local_650.context)->instPrimID[0];
                      local_774 = -1;
                      local_650.valid = &local_774;
                      local_650.geometryUserPtr = *(void **)(local_620._0_8_ + 0x18);
                      local_650.ray = (RTCRayN *)local_768;
                      local_650.hit = (RTCHitN *)&local_5a0;
                      local_650.N = 1;
                      if (*(code **)(local_620._0_8_ + 0x48) == (code *)0x0) {
LAB_016f2530:
                        p_Var17 = local_770->args->filter;
                        if (p_Var17 == (RTCFilterFunctionN)0x0) break;
                        if (((local_770->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_620._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar155 = ZEXT1664(auVar155._0_16_);
                          auVar198 = ZEXT1664(auVar198._0_16_);
                          auVar203 = ZEXT1664(auVar203._0_16_);
                          (*p_Var17)(&local_650);
                        }
                        if (*local_650.valid != 0) break;
                      }
                      else {
                        auVar155 = ZEXT1664(auVar150);
                        auVar198 = ZEXT1664(auVar198._0_16_);
                        auVar203 = ZEXT1664(auVar203._0_16_);
                        (**(code **)(local_620._0_8_ + 0x48))(&local_650);
                        if (*local_650.valid != 0) goto LAB_016f2530;
                      }
                      local_768->tfar = (float)local_460._0_4_;
                      uVar84 = (ulong)local_760 ^ 1L << (local_720._0_8_ & 0x3f);
                      local_760 = (undefined1  [8])uVar84;
                      lVar26 = 0;
                      for (uVar82 = uVar84; (uVar82 & 1) == 0;
                          uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      local_720._0_8_ = lVar26;
                      local_560._0_4_ = (int)CONCAT71((int7)((ulong)lVar26 >> 8),uVar84 != 0);
                    } while (uVar84 != 0);
                  }
                  bVar80 = local_560[0] & 1;
                  auVar166 = ZEXT3264(local_6c0);
                  auVar122 = ZEXT3264(local_600);
                  auVar171 = ZEXT3264(local_5e0);
                  auVar178 = ZEXT3264(CONCAT428(fStack_4c4,
                                                CONCAT424(fStack_4c8,
                                                          CONCAT420(fStack_4cc,
                                                                    CONCAT416(fStack_4d0,
                                                                              CONCAT412(fStack_4d4,
                                                                                        CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
                  auVar209 = ZEXT3264(local_6e0);
                  auVar211 = ZEXT3264(local_6a0);
                  uVar84 = (ulong)(uint)local_740._0_4_;
                }
LAB_016f262d:
                uVar84 = CONCAT71((int7)(uVar84 >> 8),(byte)uVar84 | bVar80);
                auVar140 = ZEXT3264(local_680);
                goto LAB_016f21ba;
              }
            }
            auVar171 = ZEXT3264(local_5e0);
            auVar140 = ZEXT3264(local_680);
            auVar122 = ZEXT3264(local_600);
            auVar178 = ZEXT3264(auVar76);
            auVar166 = ZEXT3264(local_6c0);
          }
LAB_016f21ba:
          lVar87 = lVar87 + 8;
        } while ((int)lVar87 < iVar14);
      }
      if ((uVar84 & 1) != 0) {
        return local_775;
      }
      fVar123 = local_768->tfar;
      auVar95._4_4_ = fVar123;
      auVar95._0_4_ = fVar123;
      auVar95._8_4_ = fVar123;
      auVar95._12_4_ = fVar123;
      auVar23 = vcmpps_avx(local_300,auVar95,2);
      uVar81 = vmovmskps_avx(auVar23);
      uVar81 = (uint)uVar86 & uVar81;
      local_775 = uVar81 != 0;
      ray = local_768;
      context = local_770;
      pre = local_6f0;
    } while (local_775);
  }
  return local_775;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }